

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  _func_int *p_Var6;
  int *piVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined4 uVar118;
  undefined4 uVar119;
  undefined4 uVar120;
  undefined4 uVar121;
  float afVar122 [16];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  int iVar133;
  uint uVar134;
  long lVar135;
  ulong uVar136;
  long lVar137;
  undefined1 (*pauVar138) [32];
  long lVar139;
  undefined1 (*pauVar140) [16];
  long lVar141;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 (*pauVar142) [32];
  long lVar143;
  long lVar144;
  int iVar145;
  long lVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  uint uVar150;
  uint uVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  ulong uVar156;
  uint uVar157;
  undefined1 (*pauVar158) [16];
  long lVar159;
  undefined1 (*pauVar160) [16];
  undefined1 (*pauVar161) [16];
  long lVar162;
  undefined1 auVar163 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  float fVar230;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar231 [16];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar234 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  v4sf one_4;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar263;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar264;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  v4sf one;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar335 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar336 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar337 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar338 [64];
  Option opt_flatten;
  undefined1 (*local_3b8) [32];
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  int local_3a0;
  Allocator *local_398;
  int local_390;
  int iStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  size_t local_378;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  long local_300;
  ulong local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  float local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar163 = in_ZMM29._0_16_;
  local_390 = bottom_blob->dims;
  if ((local_390 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]))) {
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3])
                ,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
    innerproduct_gemm_fp16s_sse
              (bottom_blob,top_blob,&this->weight_data_tm,(Mat *)(&this->field_0x178 + (long)p_Var6)
               ,*(int *)(&this->field_0xe0 + (long)p_Var6),(Mat *)(&this->field_0xe8 + (long)p_Var6)
               ,opt);
    return 0;
  }
  piVar7 = bottom_blob->refcount;
  local_3b8 = (undefined1 (*) [32])bottom_blob->data;
  uStack_3b0 = SUB84(bottom_blob->refcount,0);
  uStack_3ac = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_3a8 = (undefined4)bottom_blob->elemsize;
  uStack_3a4 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_3a0 = bottom_blob->elempack;
  local_398 = bottom_blob->allocator;
  uVar118 = bottom_blob->w;
  uVar119 = bottom_blob->h;
  uVar120 = bottom_blob->d;
  uVar121 = bottom_blob->c;
  local_378 = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  iStack_38c = uVar118;
  uStack_388 = uVar119;
  uStack_384 = uVar120;
  uStack_380 = uVar121;
  if (bottom_blob->dims != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_3b8);
  }
  uVar134 = 1;
  if (opt->use_packing_layout == true) {
    uVar134 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
    if ((uVar134 & 0xf) == 0) {
      uVar134 = 0x10;
    }
    else if ((uVar134 & 7) == 0) {
      uVar134 = 8;
    }
    else {
      uVar134 = (uint)((uVar134 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
                       (int)uVar134,
              (ulong)uVar134 * (CONCAT44(uStack_3a4,local_3a8) / (ulong)(long)local_3a0),uVar134,
              opt->blob_allocator);
  afVar132 = _ps512_cephes_log_q1;
  afVar131 = _ps512_cephes_exp_p5;
  afVar130 = _ps512_cephes_exp_p4;
  afVar129 = _ps512_cephes_exp_p3;
  afVar128 = _ps512_cephes_exp_p2;
  afVar127 = _ps512_cephes_exp_p1;
  afVar126 = _ps512_cephes_exp_p0;
  afVar125 = _ps512_cephes_LOG2EF;
  afVar124 = _ps512_exp_lo;
  afVar123 = _ps512_exp_hi;
  afVar122 = _ps512_1;
  iVar145 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
    iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var6);
    uVar157 = local_3a0 * iStack_38c;
    iVar133 = top_blob->elempack;
    uVar134 = top_blob->w;
    uVar156 = (ulong)uVar134;
    lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
    iVar145 = 0;
    if (7 < iVar133) {
      if (iVar133 != 8) {
        if (iVar133 == 0x10) {
          if (0 < (int)uVar134) {
            auVar215 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            auVar216 = vxorps_avx512dq(auVar215,(undefined1  [64])_ps512_cephes_log_q2);
            auVar217 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar215);
            auVar218 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
            auVar219 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar215);
            uVar136 = 0;
            auVar163 = vxorps_avx512vl(auVar163,auVar163);
            auVar338 = ZEXT1664(auVar163);
            auVar220 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar221 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
            do {
              auVar163 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              auVar335 = ZEXT1664(auVar163);
              if (lVar8 != 0) {
                auVar335 = *(undefined1 (*) [64])(lVar8 + uVar136 * 0x40);
              }
              pauVar142 = (undefined1 (*) [32])
                          ((long)(this->weight_data_tm).w * uVar136 *
                           (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
              auVar164 = in_ZMM18._0_16_;
              auVar169 = in_ZMM23._0_16_;
              auVar167 = in_ZMM21._0_16_;
              auVar168 = in_ZMM22._0_16_;
              auVar165 = in_ZMM19._0_16_;
              auVar166 = in_ZMM20._0_16_;
              auVar163 = in_ZMM17._0_16_;
              pauVar138 = local_3b8;
              if ((int)uVar157 < 8) {
                auVar164 = vxorps_avx512vl(auVar164,auVar164);
                auVar337 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar169,auVar169);
                in_ZMM23 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar167,auVar167);
                in_ZMM21 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar168,auVar168);
                in_ZMM22 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar165,auVar165);
                in_ZMM19 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar166,auVar166);
                in_ZMM20 = ZEXT1664(auVar164);
                auVar163 = vxorps_avx512vl(auVar163,auVar163);
                auVar336 = ZEXT1664(auVar163);
                uVar134 = 0;
              }
              else {
                auVar163 = vxorps_avx512vl(auVar163,auVar163);
                auVar336 = ZEXT1664(auVar163);
                iVar145 = 7;
                auVar163 = vxorps_avx512vl(auVar166,auVar166);
                in_ZMM20 = ZEXT1664(auVar163);
                auVar163 = vxorps_avx512vl(auVar165,auVar165);
                in_ZMM19 = ZEXT1664(auVar163);
                auVar163 = vxorps_avx512vl(auVar168,auVar168);
                in_ZMM22 = ZEXT1664(auVar163);
                auVar163 = vxorps_avx512vl(auVar167,auVar167);
                in_ZMM21 = ZEXT1664(auVar163);
                auVar163 = vxorps_avx512vl(auVar169,auVar169);
                in_ZMM23 = ZEXT1664(auVar163);
                auVar163 = vxorps_avx512vl(auVar164,auVar164);
                auVar337 = ZEXT1664(auVar163);
                do {
                  auVar222 = vcvtph2ps_avx512f(*pauVar142);
                  auVar223 = vcvtph2ps_avx512f(pauVar142[1]);
                  auVar224 = vcvtph2ps_avx512f(pauVar142[2]);
                  auVar225 = vcvtph2ps_avx512f(pauVar142[3]);
                  uVar1 = *(undefined4 *)*pauVar138;
                  auVar226._4_4_ = uVar1;
                  auVar226._0_4_ = uVar1;
                  auVar226._8_4_ = uVar1;
                  auVar226._12_4_ = uVar1;
                  auVar226._16_4_ = uVar1;
                  auVar226._20_4_ = uVar1;
                  auVar226._24_4_ = uVar1;
                  auVar226._28_4_ = uVar1;
                  auVar226._32_4_ = uVar1;
                  auVar226._36_4_ = uVar1;
                  auVar226._40_4_ = uVar1;
                  auVar226._44_4_ = uVar1;
                  auVar226._48_4_ = uVar1;
                  auVar226._52_4_ = uVar1;
                  auVar226._56_4_ = uVar1;
                  auVar226._60_4_ = uVar1;
                  auVar335 = vfmadd231ps_avx512f(auVar335,auVar222,auVar226);
                  uVar1 = *(undefined4 *)(*pauVar138 + 4);
                  auVar222._4_4_ = uVar1;
                  auVar222._0_4_ = uVar1;
                  auVar222._8_4_ = uVar1;
                  auVar222._12_4_ = uVar1;
                  auVar222._16_4_ = uVar1;
                  auVar222._20_4_ = uVar1;
                  auVar222._24_4_ = uVar1;
                  auVar222._28_4_ = uVar1;
                  auVar222._32_4_ = uVar1;
                  auVar222._36_4_ = uVar1;
                  auVar222._40_4_ = uVar1;
                  auVar222._44_4_ = uVar1;
                  auVar222._48_4_ = uVar1;
                  auVar222._52_4_ = uVar1;
                  auVar222._56_4_ = uVar1;
                  auVar222._60_4_ = uVar1;
                  auVar336 = vfmadd231ps_avx512f(auVar336,auVar223,auVar222);
                  uVar1 = *(undefined4 *)(*pauVar138 + 8);
                  auVar223._4_4_ = uVar1;
                  auVar223._0_4_ = uVar1;
                  auVar223._8_4_ = uVar1;
                  auVar223._12_4_ = uVar1;
                  auVar223._16_4_ = uVar1;
                  auVar223._20_4_ = uVar1;
                  auVar223._24_4_ = uVar1;
                  auVar223._28_4_ = uVar1;
                  auVar223._32_4_ = uVar1;
                  auVar223._36_4_ = uVar1;
                  auVar223._40_4_ = uVar1;
                  auVar223._44_4_ = uVar1;
                  auVar223._48_4_ = uVar1;
                  auVar223._52_4_ = uVar1;
                  auVar223._56_4_ = uVar1;
                  auVar223._60_4_ = uVar1;
                  in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar224,auVar223);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
                  auVar224._4_4_ = uVar1;
                  auVar224._0_4_ = uVar1;
                  auVar224._8_4_ = uVar1;
                  auVar224._12_4_ = uVar1;
                  auVar224._16_4_ = uVar1;
                  auVar224._20_4_ = uVar1;
                  auVar224._24_4_ = uVar1;
                  auVar224._28_4_ = uVar1;
                  auVar224._32_4_ = uVar1;
                  auVar224._36_4_ = uVar1;
                  auVar224._40_4_ = uVar1;
                  auVar224._44_4_ = uVar1;
                  auVar224._48_4_ = uVar1;
                  auVar224._52_4_ = uVar1;
                  auVar224._56_4_ = uVar1;
                  auVar224._60_4_ = uVar1;
                  in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar225,auVar224);
                  auVar226 = vcvtph2ps_avx512f(pauVar142[4]);
                  auVar222 = vcvtph2ps_avx512f(pauVar142[5]);
                  auVar223 = vcvtph2ps_avx512f(pauVar142[6]);
                  auVar224 = vcvtph2ps_avx512f(pauVar142[7]);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0x10);
                  auVar225._4_4_ = uVar1;
                  auVar225._0_4_ = uVar1;
                  auVar225._8_4_ = uVar1;
                  auVar225._12_4_ = uVar1;
                  auVar225._16_4_ = uVar1;
                  auVar225._20_4_ = uVar1;
                  auVar225._24_4_ = uVar1;
                  auVar225._28_4_ = uVar1;
                  auVar225._32_4_ = uVar1;
                  auVar225._36_4_ = uVar1;
                  auVar225._40_4_ = uVar1;
                  auVar225._44_4_ = uVar1;
                  auVar225._48_4_ = uVar1;
                  auVar225._52_4_ = uVar1;
                  auVar225._56_4_ = uVar1;
                  auVar225._60_4_ = uVar1;
                  in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar226,auVar225);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0x14);
                  auVar104._4_4_ = uVar1;
                  auVar104._0_4_ = uVar1;
                  auVar104._8_4_ = uVar1;
                  auVar104._12_4_ = uVar1;
                  auVar104._16_4_ = uVar1;
                  auVar104._20_4_ = uVar1;
                  auVar104._24_4_ = uVar1;
                  auVar104._28_4_ = uVar1;
                  auVar104._32_4_ = uVar1;
                  auVar104._36_4_ = uVar1;
                  auVar104._40_4_ = uVar1;
                  auVar104._44_4_ = uVar1;
                  auVar104._48_4_ = uVar1;
                  auVar104._52_4_ = uVar1;
                  auVar104._56_4_ = uVar1;
                  auVar104._60_4_ = uVar1;
                  in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar222,auVar104);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0x18);
                  auVar105._4_4_ = uVar1;
                  auVar105._0_4_ = uVar1;
                  auVar105._8_4_ = uVar1;
                  auVar105._12_4_ = uVar1;
                  auVar105._16_4_ = uVar1;
                  auVar105._20_4_ = uVar1;
                  auVar105._24_4_ = uVar1;
                  auVar105._28_4_ = uVar1;
                  auVar105._32_4_ = uVar1;
                  auVar105._36_4_ = uVar1;
                  auVar105._40_4_ = uVar1;
                  auVar105._44_4_ = uVar1;
                  auVar105._48_4_ = uVar1;
                  auVar105._52_4_ = uVar1;
                  auVar105._56_4_ = uVar1;
                  auVar105._60_4_ = uVar1;
                  in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar223,auVar105);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0x1c);
                  auVar106._4_4_ = uVar1;
                  auVar106._0_4_ = uVar1;
                  auVar106._8_4_ = uVar1;
                  auVar106._12_4_ = uVar1;
                  auVar106._16_4_ = uVar1;
                  auVar106._20_4_ = uVar1;
                  auVar106._24_4_ = uVar1;
                  auVar106._28_4_ = uVar1;
                  auVar106._32_4_ = uVar1;
                  auVar106._36_4_ = uVar1;
                  auVar106._40_4_ = uVar1;
                  auVar106._44_4_ = uVar1;
                  auVar106._48_4_ = uVar1;
                  auVar106._52_4_ = uVar1;
                  auVar106._56_4_ = uVar1;
                  auVar106._60_4_ = uVar1;
                  auVar337 = vfmadd231ps_avx512f(auVar337,auVar224,auVar106);
                  pauVar138 = pauVar138 + 1;
                  pauVar142 = pauVar142 + 8;
                  iVar145 = iVar145 + 8;
                  uVar134 = uVar157 & 0xfffffff8;
                } while (iVar145 < (int)uVar157);
              }
              uVar150 = uVar134 | 3;
              while ((int)uVar150 < (int)uVar157) {
                auVar226 = vcvtph2ps_avx512f(*pauVar142);
                auVar222 = vcvtph2ps_avx512f(pauVar142[1]);
                auVar223 = vcvtph2ps_avx512f(pauVar142[2]);
                auVar224 = vcvtph2ps_avx512f(pauVar142[3]);
                uVar1 = *(undefined4 *)*pauVar138;
                auVar107._4_4_ = uVar1;
                auVar107._0_4_ = uVar1;
                auVar107._8_4_ = uVar1;
                auVar107._12_4_ = uVar1;
                auVar107._16_4_ = uVar1;
                auVar107._20_4_ = uVar1;
                auVar107._24_4_ = uVar1;
                auVar107._28_4_ = uVar1;
                auVar107._32_4_ = uVar1;
                auVar107._36_4_ = uVar1;
                auVar107._40_4_ = uVar1;
                auVar107._44_4_ = uVar1;
                auVar107._48_4_ = uVar1;
                auVar107._52_4_ = uVar1;
                auVar107._56_4_ = uVar1;
                auVar107._60_4_ = uVar1;
                auVar335 = vfmadd231ps_avx512f(auVar335,auVar226,auVar107);
                uVar1 = *(undefined4 *)(*pauVar138 + 4);
                auVar108._4_4_ = uVar1;
                auVar108._0_4_ = uVar1;
                auVar108._8_4_ = uVar1;
                auVar108._12_4_ = uVar1;
                auVar108._16_4_ = uVar1;
                auVar108._20_4_ = uVar1;
                auVar108._24_4_ = uVar1;
                auVar108._28_4_ = uVar1;
                auVar108._32_4_ = uVar1;
                auVar108._36_4_ = uVar1;
                auVar108._40_4_ = uVar1;
                auVar108._44_4_ = uVar1;
                auVar108._48_4_ = uVar1;
                auVar108._52_4_ = uVar1;
                auVar108._56_4_ = uVar1;
                auVar108._60_4_ = uVar1;
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar222,auVar108);
                uVar1 = *(undefined4 *)(*pauVar138 + 8);
                auVar109._4_4_ = uVar1;
                auVar109._0_4_ = uVar1;
                auVar109._8_4_ = uVar1;
                auVar109._12_4_ = uVar1;
                auVar109._16_4_ = uVar1;
                auVar109._20_4_ = uVar1;
                auVar109._24_4_ = uVar1;
                auVar109._28_4_ = uVar1;
                auVar109._32_4_ = uVar1;
                auVar109._36_4_ = uVar1;
                auVar109._40_4_ = uVar1;
                auVar109._44_4_ = uVar1;
                auVar109._48_4_ = uVar1;
                auVar109._52_4_ = uVar1;
                auVar109._56_4_ = uVar1;
                auVar109._60_4_ = uVar1;
                in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar223,auVar109);
                uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
                auVar110._4_4_ = uVar1;
                auVar110._0_4_ = uVar1;
                auVar110._8_4_ = uVar1;
                auVar110._12_4_ = uVar1;
                auVar110._16_4_ = uVar1;
                auVar110._20_4_ = uVar1;
                auVar110._24_4_ = uVar1;
                auVar110._28_4_ = uVar1;
                auVar110._32_4_ = uVar1;
                auVar110._36_4_ = uVar1;
                auVar110._40_4_ = uVar1;
                auVar110._44_4_ = uVar1;
                auVar110._48_4_ = uVar1;
                auVar110._52_4_ = uVar1;
                auVar110._56_4_ = uVar1;
                auVar110._60_4_ = uVar1;
                in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar224,auVar110);
                pauVar138 = (undefined1 (*) [32])(*pauVar138 + 0x10);
                pauVar142 = pauVar142 + 4;
                uVar150 = uVar134 + 7;
                uVar134 = uVar134 + 4;
              }
              if (uVar157 - uVar134 != 0 && (int)uVar134 <= (int)uVar157) {
                lVar146 = 0;
                do {
                  auVar189 = vlddqu_avx(*pauVar142);
                  auVar226 = vcvtph2ps_avx512f(auVar189);
                  uVar1 = *(undefined4 *)(*pauVar138 + lVar146 * 4);
                  auVar111._4_4_ = uVar1;
                  auVar111._0_4_ = uVar1;
                  auVar111._8_4_ = uVar1;
                  auVar111._12_4_ = uVar1;
                  auVar111._16_4_ = uVar1;
                  auVar111._20_4_ = uVar1;
                  auVar111._24_4_ = uVar1;
                  auVar111._28_4_ = uVar1;
                  auVar111._32_4_ = uVar1;
                  auVar111._36_4_ = uVar1;
                  auVar111._40_4_ = uVar1;
                  auVar111._44_4_ = uVar1;
                  auVar111._48_4_ = uVar1;
                  auVar111._52_4_ = uVar1;
                  auVar111._56_4_ = uVar1;
                  auVar111._60_4_ = uVar1;
                  auVar335 = vfmadd231ps_avx512f(auVar335,auVar226,auVar111);
                  pauVar142 = pauVar142 + 1;
                  lVar146 = lVar146 + 1;
                } while (uVar157 - uVar134 != (int)lVar146);
              }
              auVar337 = vaddps_avx512f(in_ZMM23,auVar337);
              auVar226 = vaddps_avx512f(in_ZMM21,in_ZMM22);
              auVar337 = vaddps_avx512f(auVar337,auVar226);
              in_ZMM18 = vaddps_avx512f(in_ZMM19,in_ZMM20);
              in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar336);
              auVar336 = vaddps_avx512f(auVar337,in_ZMM17);
              auVar335 = vaddps_avx512f(auVar336,auVar335);
              in_ZMM16 = auVar335;
              switch(iVar5) {
              case 1:
                in_ZMM16 = vmaxps_avx512f(auVar335,auVar338);
                break;
              case 2:
                uVar13 = vcmpps_avx512f(auVar335,auVar338,1);
                uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
                auVar113._4_4_ = uVar1;
                auVar113._0_4_ = uVar1;
                auVar113._8_4_ = uVar1;
                auVar113._12_4_ = uVar1;
                auVar113._16_4_ = uVar1;
                auVar113._20_4_ = uVar1;
                auVar113._24_4_ = uVar1;
                auVar113._28_4_ = uVar1;
                auVar113._32_4_ = uVar1;
                auVar113._36_4_ = uVar1;
                auVar113._40_4_ = uVar1;
                auVar113._44_4_ = uVar1;
                auVar113._48_4_ = uVar1;
                auVar113._52_4_ = uVar1;
                auVar113._56_4_ = uVar1;
                auVar113._60_4_ = uVar1;
                auVar336 = vmulps_avx512f(auVar335,auVar113);
                bVar11 = (bool)((byte)uVar13 & 1);
                in_ZMM16._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar335._0_4_;
                bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
                in_ZMM16._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar335._4_4_;
                bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
                in_ZMM16._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar335._8_4_;
                bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
                in_ZMM16._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar335._12_4_;
                bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
                in_ZMM16._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar335._16_4_;
                bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                in_ZMM16._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar335._20_4_;
                bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                in_ZMM16._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar335._24_4_;
                bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
                in_ZMM16._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar335._28_4_;
                bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
                in_ZMM16._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar335._32_4_;
                bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
                in_ZMM16._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar335._36_4_;
                bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
                in_ZMM16._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar335._40_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
                in_ZMM16._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar335._44_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
                in_ZMM16._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar335._48_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
                in_ZMM16._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar335._52_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
                in_ZMM16._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar335._56_4_;
                bVar11 = SUB81(uVar13 >> 0xf,0);
                in_ZMM16._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar335._60_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
                auVar112._4_4_ = uVar1;
                auVar112._0_4_ = uVar1;
                auVar112._8_4_ = uVar1;
                auVar112._12_4_ = uVar1;
                auVar112._16_4_ = uVar1;
                auVar112._20_4_ = uVar1;
                auVar112._24_4_ = uVar1;
                auVar112._28_4_ = uVar1;
                auVar112._32_4_ = uVar1;
                auVar112._36_4_ = uVar1;
                auVar112._40_4_ = uVar1;
                auVar112._44_4_ = uVar1;
                auVar112._48_4_ = uVar1;
                auVar112._52_4_ = uVar1;
                auVar112._56_4_ = uVar1;
                auVar112._60_4_ = uVar1;
                auVar336 = vmaxps_avx512f(auVar335,auVar112);
                uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
                auVar335._4_4_ = uVar1;
                auVar335._0_4_ = uVar1;
                auVar335._8_4_ = uVar1;
                auVar335._12_4_ = uVar1;
                auVar335._16_4_ = uVar1;
                auVar335._20_4_ = uVar1;
                auVar335._24_4_ = uVar1;
                auVar335._28_4_ = uVar1;
                auVar335._32_4_ = uVar1;
                auVar335._36_4_ = uVar1;
                auVar335._40_4_ = uVar1;
                auVar335._44_4_ = uVar1;
                auVar335._48_4_ = uVar1;
                auVar335._52_4_ = uVar1;
                auVar335._56_4_ = uVar1;
                auVar335._60_4_ = uVar1;
                in_ZMM16 = vminps_avx512f(auVar336,auVar335);
                break;
              case 4:
                auVar335 = vxorps_avx512dq(auVar335,auVar215);
                auVar335 = vminps_avx512f(auVar335,(undefined1  [64])afVar123);
                auVar335 = vmaxps_avx512f(auVar335,(undefined1  [64])afVar124);
                auVar336 = vfmadd213ps_avx512f((undefined1  [64])afVar125,auVar335,
                                               (undefined1  [64])afVar131);
                auVar337 = vrndscaleps_avx512f(auVar336,1);
                uVar13 = vcmpps_avx512f(auVar336,auVar337,1);
                auVar336 = vsubps_avx512f(auVar337,(undefined1  [64])afVar122);
                bVar11 = (bool)((byte)uVar13 & 1);
                in_ZMM17._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar337._0_4_;
                bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
                in_ZMM17._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar337._4_4_;
                bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
                in_ZMM17._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar337._8_4_;
                bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
                in_ZMM17._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar337._12_4_;
                bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
                in_ZMM17._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar337._16_4_;
                bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                in_ZMM17._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar337._20_4_;
                bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                in_ZMM17._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar337._24_4_;
                bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
                in_ZMM17._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar337._28_4_;
                bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
                in_ZMM17._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar337._32_4_;
                bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
                in_ZMM17._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar337._36_4_;
                bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
                in_ZMM17._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar337._40_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
                in_ZMM17._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar337._44_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
                in_ZMM17._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar337._48_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
                in_ZMM17._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar337._52_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
                in_ZMM17._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar337._56_4_;
                bVar11 = SUB81(uVar13 >> 0xf,0);
                in_ZMM17._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar337._60_4_;
                auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM17,auVar216);
                auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM17,auVar217);
                auVar336 = vmulps_avx512f(auVar335,auVar335);
                auVar337 = vfmadd213ps_avx512f(auVar335,(undefined1  [64])afVar126,
                                               (undefined1  [64])afVar127);
                auVar337 = vfmadd213ps_avx512f(auVar337,auVar335,(undefined1  [64])afVar128);
                auVar337 = vfmadd213ps_avx512f(auVar337,auVar335,(undefined1  [64])afVar129);
                auVar337 = vfmadd213ps_avx512f(auVar337,auVar335,(undefined1  [64])afVar130);
                auVar337 = vfmadd213ps_avx512f(auVar337,auVar335,(undefined1  [64])afVar131);
                in_ZMM18 = vfmadd213ps_avx512f(auVar337,auVar336,auVar335);
                auVar335 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar122);
                auVar336 = vcvttps2dq_avx512f(in_ZMM17);
                auVar336 = vpaddd_avx512f(auVar336,auVar218);
                auVar336 = vpslld_avx512f(auVar336,0x17);
                auVar335 = vfmadd213ps_avx512f(auVar336,auVar335,auVar220);
                auVar336 = vrcp14ps_avx512f(auVar335);
                auVar335 = vfmsub213ps_avx512f(auVar335,auVar336,auVar220);
                in_ZMM16 = vfnmadd132ps_avx512vl(auVar335,auVar336,auVar336);
                break;
              case 5:
                auVar336 = vminps_avx512f(auVar335,(undefined1  [64])afVar123);
                auVar336 = vmaxps_avx512f(auVar336,(undefined1  [64])afVar124);
                auVar337 = vfmadd213ps_avx512f((undefined1  [64])afVar125,auVar336,
                                               (undefined1  [64])afVar131);
                auVar226 = vrndscaleps_avx512f(auVar337,1);
                uVar13 = vcmpps_avx512f(auVar337,auVar226,1);
                auVar337 = vsubps_avx512f(auVar226,(undefined1  [64])afVar122);
                bVar11 = (bool)((byte)uVar13 & 1);
                auVar227._0_4_ = (uint)bVar11 * auVar337._0_4_ | (uint)!bVar11 * auVar226._0_4_;
                bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
                auVar227._4_4_ = (uint)bVar11 * auVar337._4_4_ | (uint)!bVar11 * auVar226._4_4_;
                bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
                auVar227._8_4_ = (uint)bVar11 * auVar337._8_4_ | (uint)!bVar11 * auVar226._8_4_;
                bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
                auVar227._12_4_ = (uint)bVar11 * auVar337._12_4_ | (uint)!bVar11 * auVar226._12_4_;
                bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
                auVar227._16_4_ = (uint)bVar11 * auVar337._16_4_ | (uint)!bVar11 * auVar226._16_4_;
                bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                auVar227._20_4_ = (uint)bVar11 * auVar337._20_4_ | (uint)!bVar11 * auVar226._20_4_;
                bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                auVar227._24_4_ = (uint)bVar11 * auVar337._24_4_ | (uint)!bVar11 * auVar226._24_4_;
                bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
                auVar227._28_4_ = (uint)bVar11 * auVar337._28_4_ | (uint)!bVar11 * auVar226._28_4_;
                bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
                auVar227._32_4_ = (uint)bVar11 * auVar337._32_4_ | (uint)!bVar11 * auVar226._32_4_;
                bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
                auVar227._36_4_ = (uint)bVar11 * auVar337._36_4_ | (uint)!bVar11 * auVar226._36_4_;
                bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
                auVar227._40_4_ = (uint)bVar11 * auVar337._40_4_ | (uint)!bVar11 * auVar226._40_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
                auVar227._44_4_ = (uint)bVar11 * auVar337._44_4_ | (uint)!bVar11 * auVar226._44_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
                auVar227._48_4_ = (uint)bVar11 * auVar337._48_4_ | (uint)!bVar11 * auVar226._48_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
                auVar227._52_4_ = (uint)bVar11 * auVar337._52_4_ | (uint)!bVar11 * auVar226._52_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
                auVar227._56_4_ = (uint)bVar11 * auVar337._56_4_ | (uint)!bVar11 * auVar226._56_4_;
                bVar11 = SUB81(uVar13 >> 0xf,0);
                auVar227._60_4_ = (uint)bVar11 * auVar337._60_4_ | (uint)!bVar11 * auVar226._60_4_;
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar227,auVar216);
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar227,auVar217);
                auVar337 = vmulps_avx512f(auVar336,auVar336);
                auVar226 = vfmadd213ps_avx512f(auVar336,(undefined1  [64])afVar126,
                                               (undefined1  [64])afVar127);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar336,(undefined1  [64])afVar128);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar336,(undefined1  [64])afVar129);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar336,(undefined1  [64])afVar130);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar336,(undefined1  [64])afVar131);
                auVar336 = vfmadd213ps_avx512f(auVar226,auVar337,auVar336);
                auVar336 = vaddps_avx512f(auVar336,(undefined1  [64])afVar122);
                auVar337 = vcvttps2dq_avx512f(auVar227);
                auVar337 = vpaddd_avx512f(auVar337,auVar218);
                auVar337 = vpslld_avx512f(auVar337,0x17);
                auVar336 = vfmadd213ps_avx512f(auVar337,auVar336,auVar220);
                auVar337 = vmaxps_avx512f(auVar336,(undefined1  [64])_ps512_min_norm_pos);
                auVar226 = vpsrld_avx512f(auVar337,0x17);
                auVar337 = vpternlogd_avx512f(auVar337,(undefined1  [64])afVar131,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar13 = vcmpps_avx512f(auVar337,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar222 = vsubps_avx512f(auVar337,(undefined1  [64])afVar122);
                auVar337 = vaddps_avx512f(auVar222,auVar337);
                bVar11 = (bool)((byte)uVar13 & 1);
                auVar228._0_4_ = (uint)bVar11 * auVar337._0_4_ | (uint)!bVar11 * auVar222._0_4_;
                bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
                auVar228._4_4_ = (uint)bVar11 * auVar337._4_4_ | (uint)!bVar11 * auVar222._4_4_;
                bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
                auVar228._8_4_ = (uint)bVar11 * auVar337._8_4_ | (uint)!bVar11 * auVar222._8_4_;
                bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
                auVar228._12_4_ = (uint)bVar11 * auVar337._12_4_ | (uint)!bVar11 * auVar222._12_4_;
                bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
                auVar228._16_4_ = (uint)bVar11 * auVar337._16_4_ | (uint)!bVar11 * auVar222._16_4_;
                bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                auVar228._20_4_ = (uint)bVar11 * auVar337._20_4_ | (uint)!bVar11 * auVar222._20_4_;
                bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                auVar228._24_4_ = (uint)bVar11 * auVar337._24_4_ | (uint)!bVar11 * auVar222._24_4_;
                bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
                auVar228._28_4_ = (uint)bVar11 * auVar337._28_4_ | (uint)!bVar11 * auVar222._28_4_;
                bVar12 = (byte)(uVar13 >> 8);
                bVar11 = (bool)(bVar12 & 1);
                auVar228._32_4_ = (uint)bVar11 * auVar337._32_4_ | (uint)!bVar11 * auVar222._32_4_;
                bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
                auVar228._36_4_ = (uint)bVar11 * auVar337._36_4_ | (uint)!bVar11 * auVar222._36_4_;
                bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
                auVar228._40_4_ = (uint)bVar11 * auVar337._40_4_ | (uint)!bVar11 * auVar222._40_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
                auVar228._44_4_ = (uint)bVar11 * auVar337._44_4_ | (uint)!bVar11 * auVar222._44_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
                auVar228._48_4_ = (uint)bVar11 * auVar337._48_4_ | (uint)!bVar11 * auVar222._48_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
                auVar228._52_4_ = (uint)bVar11 * auVar337._52_4_ | (uint)!bVar11 * auVar222._52_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
                auVar228._56_4_ = (uint)bVar11 * auVar337._56_4_ | (uint)!bVar11 * auVar222._56_4_;
                bVar11 = SUB81(uVar13 >> 0xf,0);
                auVar228._60_4_ = (uint)bVar11 * auVar337._60_4_ | (uint)!bVar11 * auVar222._60_4_;
                auVar337 = vmulps_avx512f(auVar228,auVar228);
                auVar222 = vfmadd132ps_avx512f(auVar228,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar222 = vfmadd213ps_avx512f(auVar222,auVar228,
                                               (undefined1  [64])_ps512_cephes_log_p2);
                auVar222 = vfmadd213ps_avx512f(auVar222,auVar228,
                                               (undefined1  [64])_ps512_cephes_log_p3);
                auVar222 = vfmadd213ps_avx512f(auVar222,auVar228,
                                               (undefined1  [64])_ps512_cephes_log_p4);
                auVar222 = vfmadd213ps_avx512f(auVar222,auVar228,
                                               (undefined1  [64])_ps512_cephes_log_p5);
                auVar222 = vfmadd213ps_avx512f(auVar222,auVar228,
                                               (undefined1  [64])_ps512_cephes_log_p6);
                auVar222 = vfmadd213ps_avx512f(auVar222,auVar228,
                                               (undefined1  [64])_ps512_cephes_log_p7);
                in_ZMM20 = vfmadd213ps_avx512f(auVar222,auVar228,
                                               (undefined1  [64])_ps512_cephes_log_p8);
                auVar222 = vmulps_avx512f(auVar337,auVar228);
                auVar222 = vfmadd213ps_avx512f(auVar222,in_ZMM20,auVar228);
                uVar14 = vcmpps_avx512f(auVar336,auVar338,2);
                auVar336 = vpsubd_avx512f(auVar226,auVar218);
                auVar336 = vcvtdq2ps_avx512f(auVar336);
                auVar226 = vaddps_avx512f(auVar336,(undefined1  [64])afVar122);
                bVar11 = (bool)((byte)uVar13 & 1);
                auVar229._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar226._0_4_;
                bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
                auVar229._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar226._4_4_;
                bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
                auVar229._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar226._8_4_;
                bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
                auVar229._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar226._12_4_;
                bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
                auVar229._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar226._16_4_;
                bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                auVar229._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar226._20_4_;
                bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                auVar229._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar226._24_4_;
                bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
                auVar229._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar226._28_4_;
                bVar11 = (bool)(bVar12 & 1);
                auVar229._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar226._32_4_;
                bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
                auVar229._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar226._36_4_;
                bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
                auVar229._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar226._40_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
                auVar229._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar226._44_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
                auVar229._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar226._48_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
                auVar229._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar226._52_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
                auVar229._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar226._56_4_;
                bVar11 = SUB81(uVar13 >> 0xf,0);
                auVar229._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar226._60_4_;
                auVar336 = vfmadd231ps_avx512f(auVar222,auVar229,(undefined1  [64])afVar132);
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar219,auVar337);
                in_ZMM21 = vfmadd231ps_avx512f(auVar336,auVar229,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar336 = vmulps_avx512f(in_ZMM21,auVar221);
                auVar226 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar11 = (bool)((byte)uVar14 & 1);
                auVar337._0_4_ = (uint)bVar11 * auVar226._0_4_ | (uint)!bVar11 * auVar336._0_4_;
                bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
                auVar337._4_4_ = (uint)bVar11 * auVar226._4_4_ | (uint)!bVar11 * auVar336._4_4_;
                bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
                auVar337._8_4_ = (uint)bVar11 * auVar226._8_4_ | (uint)!bVar11 * auVar336._8_4_;
                bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
                auVar337._12_4_ = (uint)bVar11 * auVar226._12_4_ | (uint)!bVar11 * auVar336._12_4_;
                bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
                auVar337._16_4_ = (uint)bVar11 * auVar226._16_4_ | (uint)!bVar11 * auVar336._16_4_;
                bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
                auVar337._20_4_ = (uint)bVar11 * auVar226._20_4_ | (uint)!bVar11 * auVar336._20_4_;
                bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
                auVar337._24_4_ = (uint)bVar11 * auVar226._24_4_ | (uint)!bVar11 * auVar336._24_4_;
                bVar11 = (bool)((byte)(uVar14 >> 7) & 1);
                auVar337._28_4_ = (uint)bVar11 * auVar226._28_4_ | (uint)!bVar11 * auVar336._28_4_;
                bVar11 = (bool)((byte)(uVar14 >> 8) & 1);
                auVar337._32_4_ = (uint)bVar11 * auVar226._32_4_ | (uint)!bVar11 * auVar336._32_4_;
                bVar11 = (bool)((byte)(uVar14 >> 9) & 1);
                auVar337._36_4_ = (uint)bVar11 * auVar226._36_4_ | (uint)!bVar11 * auVar336._36_4_;
                bVar11 = (bool)((byte)(uVar14 >> 10) & 1);
                auVar337._40_4_ = (uint)bVar11 * auVar226._40_4_ | (uint)!bVar11 * auVar336._40_4_;
                bVar11 = (bool)((byte)(uVar14 >> 0xb) & 1);
                auVar337._44_4_ = (uint)bVar11 * auVar226._44_4_ | (uint)!bVar11 * auVar336._44_4_;
                bVar11 = (bool)((byte)(uVar14 >> 0xc) & 1);
                auVar337._48_4_ = (uint)bVar11 * auVar226._48_4_ | (uint)!bVar11 * auVar336._48_4_;
                bVar11 = (bool)((byte)(uVar14 >> 0xd) & 1);
                auVar337._52_4_ = (uint)bVar11 * auVar226._52_4_ | (uint)!bVar11 * auVar336._52_4_;
                bVar11 = (bool)((byte)(uVar14 >> 0xe) & 1);
                auVar337._56_4_ = (uint)bVar11 * auVar226._56_4_ | (uint)!bVar11 * auVar336._56_4_;
                bVar11 = SUB81(uVar14 >> 0xf,0);
                auVar337._60_4_ = (uint)bVar11 * auVar226._60_4_ | (uint)!bVar11 * auVar336._60_4_;
                auVar336 = vminps_avx512f(auVar337,(undefined1  [64])afVar123);
                auVar336 = vmaxps_avx512f(auVar336,(undefined1  [64])afVar124);
                auVar337 = vfmadd213ps_avx512f((undefined1  [64])afVar125,auVar336,
                                               (undefined1  [64])afVar131);
                auVar226 = vrndscaleps_avx512f(auVar337,1);
                uVar13 = vcmpps_avx512f(auVar337,auVar226,1);
                auVar337 = vsubps_avx512f(auVar226,(undefined1  [64])afVar122);
                bVar11 = (bool)((byte)uVar13 & 1);
                in_ZMM18._0_4_ = (uint)bVar11 * auVar337._0_4_ | (uint)!bVar11 * auVar226._0_4_;
                bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
                in_ZMM18._4_4_ = (uint)bVar11 * auVar337._4_4_ | (uint)!bVar11 * auVar226._4_4_;
                bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
                in_ZMM18._8_4_ = (uint)bVar11 * auVar337._8_4_ | (uint)!bVar11 * auVar226._8_4_;
                bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
                in_ZMM18._12_4_ = (uint)bVar11 * auVar337._12_4_ | (uint)!bVar11 * auVar226._12_4_;
                bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
                in_ZMM18._16_4_ = (uint)bVar11 * auVar337._16_4_ | (uint)!bVar11 * auVar226._16_4_;
                bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
                in_ZMM18._20_4_ = (uint)bVar11 * auVar337._20_4_ | (uint)!bVar11 * auVar226._20_4_;
                bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                in_ZMM18._24_4_ = (uint)bVar11 * auVar337._24_4_ | (uint)!bVar11 * auVar226._24_4_;
                bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
                in_ZMM18._28_4_ = (uint)bVar11 * auVar337._28_4_ | (uint)!bVar11 * auVar226._28_4_;
                bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
                in_ZMM18._32_4_ = (uint)bVar11 * auVar337._32_4_ | (uint)!bVar11 * auVar226._32_4_;
                bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
                in_ZMM18._36_4_ = (uint)bVar11 * auVar337._36_4_ | (uint)!bVar11 * auVar226._36_4_;
                bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
                in_ZMM18._40_4_ = (uint)bVar11 * auVar337._40_4_ | (uint)!bVar11 * auVar226._40_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
                in_ZMM18._44_4_ = (uint)bVar11 * auVar337._44_4_ | (uint)!bVar11 * auVar226._44_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
                in_ZMM18._48_4_ = (uint)bVar11 * auVar337._48_4_ | (uint)!bVar11 * auVar226._48_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
                in_ZMM18._52_4_ = (uint)bVar11 * auVar337._52_4_ | (uint)!bVar11 * auVar226._52_4_;
                bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
                in_ZMM18._56_4_ = (uint)bVar11 * auVar337._56_4_ | (uint)!bVar11 * auVar226._56_4_;
                bVar11 = SUB81(uVar13 >> 0xf,0);
                in_ZMM18._60_4_ = (uint)bVar11 * auVar337._60_4_ | (uint)!bVar11 * auVar226._60_4_;
                auVar336 = vfmadd231ps_avx512f(auVar336,in_ZMM18,auVar216);
                auVar336 = vfmadd231ps_avx512f(auVar336,in_ZMM18,auVar217);
                auVar337 = vmulps_avx512f(auVar336,auVar336);
                auVar226 = vfmadd213ps_avx512f(auVar336,(undefined1  [64])afVar126,
                                               (undefined1  [64])afVar127);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar336,(undefined1  [64])afVar128);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar336,(undefined1  [64])afVar129);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar336,(undefined1  [64])afVar130);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar336,(undefined1  [64])afVar131);
                in_ZMM19 = vfmadd213ps_avx512f(auVar226,auVar337,auVar336);
                auVar336 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar122);
                auVar337 = vcvttps2dq_avx512f(in_ZMM18);
                auVar337 = vpaddd_avx512f(auVar337,auVar218);
                auVar337 = vpslld_avx512f(auVar337,0x17);
                auVar336 = vfmadd213ps_avx512f(auVar337,auVar336,auVar220);
                auVar337 = vrcp14ps_avx512f(auVar336);
                auVar336 = vfmsub213ps_avx512f(auVar336,auVar337,auVar220);
                auVar336 = vfnmadd132ps_avx512vl(auVar336,auVar337,auVar337);
                in_ZMM17 = vfnmsub213ps_avx512f(auVar336,auVar221,auVar220);
                in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar335);
                break;
              case 6:
                auVar337 = vbroadcastss_avx512f
                                     (ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
                uVar134 = (*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
                auVar336._4_4_ = uVar134;
                auVar336._0_4_ = uVar134;
                auVar336._8_4_ = uVar134;
                auVar336._12_4_ = uVar134;
                auVar336._16_4_ = uVar134;
                auVar336._20_4_ = uVar134;
                auVar336._24_4_ = uVar134;
                auVar336._28_4_ = uVar134;
                auVar336._32_4_ = uVar134;
                auVar336._36_4_ = uVar134;
                auVar336._40_4_ = uVar134;
                auVar336._44_4_ = uVar134;
                auVar336._48_4_ = uVar134;
                auVar336._52_4_ = uVar134;
                auVar336._56_4_ = uVar134;
                auVar336._60_4_ = uVar134;
                auVar336 = vfmadd213ps_avx512f(auVar337,auVar335,auVar336);
                auVar336 = vmaxps_avx512f(auVar336,auVar338);
                auVar336 = vminps_avx512f(auVar336,auVar220);
                in_ZMM16 = vmulps_avx512f(auVar336,auVar335);
              }
              *(undefined1 (*) [64])((long)top_blob->data + uVar136 * 0x40) = in_ZMM16;
              uVar136 = uVar136 + 1;
            } while (uVar136 != uVar156);
          }
          iVar145 = 0;
        }
        goto LAB_002bb756;
      }
      if (0 < (int)uVar134) {
        uVar136 = 0;
        auVar189 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar190 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar260._8_4_ = 0x3f000000;
        auVar260._0_8_ = 0x3f0000003f000000;
        auVar260._12_4_ = 0x3f000000;
        auVar260._16_4_ = 0x3f000000;
        auVar260._20_4_ = 0x3f000000;
        auVar260._24_4_ = 0x3f000000;
        auVar260._28_4_ = 0x3f000000;
        auVar291._8_4_ = 0x3fb8aa3b;
        auVar291._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar291._12_4_ = 0x3fb8aa3b;
        auVar291._16_4_ = 0x3fb8aa3b;
        auVar291._20_4_ = 0x3fb8aa3b;
        auVar291._24_4_ = 0x3fb8aa3b;
        auVar291._28_4_ = 0x3fb8aa3b;
        auVar296._8_4_ = 0x3f800000;
        auVar296._0_8_ = 0x3f8000003f800000;
        auVar296._12_4_ = 0x3f800000;
        auVar296._16_4_ = 0x3f800000;
        auVar296._20_4_ = 0x3f800000;
        auVar296._24_4_ = 0x3f800000;
        auVar296._28_4_ = 0x3f800000;
        auVar301._8_4_ = 0x3f318000;
        auVar301._0_8_ = 0x3f3180003f318000;
        auVar301._12_4_ = 0x3f318000;
        auVar301._16_4_ = 0x3f318000;
        auVar301._20_4_ = 0x3f318000;
        auVar301._24_4_ = 0x3f318000;
        auVar301._28_4_ = 0x3f318000;
        auVar309._8_4_ = 0x39506967;
        auVar309._0_8_ = 0x3950696739506967;
        auVar309._12_4_ = 0x39506967;
        auVar309._16_4_ = 0x39506967;
        auVar309._20_4_ = 0x39506967;
        auVar309._24_4_ = 0x39506967;
        auVar309._28_4_ = 0x39506967;
        auVar313._8_4_ = 0x3ab743ce;
        auVar313._0_8_ = 0x3ab743ce3ab743ce;
        auVar313._12_4_ = 0x3ab743ce;
        auVar313._16_4_ = 0x3ab743ce;
        auVar313._20_4_ = 0x3ab743ce;
        auVar313._24_4_ = 0x3ab743ce;
        auVar313._28_4_ = 0x3ab743ce;
        auVar317._8_4_ = 0x3c088908;
        auVar317._0_8_ = 0x3c0889083c088908;
        auVar317._12_4_ = 0x3c088908;
        auVar317._16_4_ = 0x3c088908;
        auVar317._20_4_ = 0x3c088908;
        auVar317._24_4_ = 0x3c088908;
        auVar317._28_4_ = 0x3c088908;
        auVar321._8_4_ = 0x3d2aa9c1;
        auVar321._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar321._12_4_ = 0x3d2aa9c1;
        auVar321._16_4_ = 0x3d2aa9c1;
        auVar321._20_4_ = 0x3d2aa9c1;
        auVar321._24_4_ = 0x3d2aa9c1;
        auVar321._28_4_ = 0x3d2aa9c1;
        auVar326._8_4_ = 0x3e2aaaaa;
        auVar326._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar326._12_4_ = 0x3e2aaaaa;
        auVar326._16_4_ = 0x3e2aaaaa;
        auVar326._20_4_ = 0x3e2aaaaa;
        auVar326._24_4_ = 0x3e2aaaaa;
        auVar326._28_4_ = 0x3e2aaaaa;
        auVar329._8_4_ = 0x3f800000;
        auVar329._0_8_ = 0x3f8000003f800000;
        auVar329._12_4_ = 0x3f800000;
        auVar329._16_4_ = 0x3f800000;
        auVar329._20_4_ = 0x3f800000;
        auVar329._24_4_ = 0x3f800000;
        auVar329._28_4_ = 0x3f800000;
        auVar333._8_4_ = 0xb95e8083;
        auVar333._0_8_ = 0xb95e8083b95e8083;
        auVar333._12_4_ = 0xb95e8083;
        auVar333._16_4_ = 0xb95e8083;
        auVar333._20_4_ = 0xb95e8083;
        auVar333._24_4_ = 0xb95e8083;
        auVar333._28_4_ = 0xb95e8083;
        auVar191 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar192 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar194 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar195 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar196 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          auVar215 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar8 != 0) {
            auVar215 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar136 * 0x20));
          }
          pauVar142 = (undefined1 (*) [32])
                      ((long)(this->weight_data_tm).w * uVar136 * (this->weight_data_tm).elemsize +
                      (long)(this->weight_data_tm).data);
          auVar164 = in_ZMM17._0_16_;
          auVar163 = in_ZMM16._0_16_;
          auVar167 = in_ZMM20._0_16_;
          auVar166 = in_ZMM19._0_16_;
          auVar168 = in_ZMM23._0_16_;
          auVar165 = in_ZMM18._0_16_;
          pauVar138 = local_3b8;
          if ((int)uVar157 < 8) {
            auVar165 = vxorps_avx512vl(auVar165,auVar165);
            in_ZMM18 = ZEXT1664(auVar165);
            auVar165 = vxorps_avx512vl(auVar168,auVar168);
            in_ZMM23 = ZEXT1664(auVar165);
            auVar165 = vxorps_avx512vl(auVar166,auVar166);
            in_ZMM19 = ZEXT1664(auVar165);
            auVar165 = vxorps_avx512vl(auVar167,auVar167);
            in_ZMM20 = ZEXT1664(auVar165);
            auVar163 = vxorps_avx512vl(auVar163,auVar163);
            in_ZMM16 = ZEXT1664(auVar163);
            auVar163 = vxorps_avx512vl(auVar164,auVar164);
            in_ZMM17 = ZEXT1664(auVar163);
            auVar216 = ZEXT864(0);
            uVar150 = 0;
          }
          else {
            auVar216 = ZEXT864(0);
            iVar145 = 7;
            auVar164 = vxorps_avx512vl(auVar164,auVar164);
            in_ZMM17 = ZEXT1664(auVar164);
            auVar163 = vxorps_avx512vl(auVar163,auVar163);
            in_ZMM16 = ZEXT1664(auVar163);
            auVar163 = vxorps_avx512vl(auVar167,auVar167);
            in_ZMM20 = ZEXT1664(auVar163);
            auVar163 = vxorps_avx512vl(auVar166,auVar166);
            in_ZMM19 = ZEXT1664(auVar163);
            auVar163 = vxorps_avx512vl(auVar168,auVar168);
            in_ZMM23 = ZEXT1664(auVar163);
            auVar163 = vxorps_avx512vl(auVar165,auVar165);
            in_ZMM18 = ZEXT1664(auVar163);
            do {
              auVar200 = vlddqu_avx(*pauVar142);
              auVar201 = vlddqu_avx(pauVar142[1]);
              auVar197 = vcvtph2ps_avx512vl(auVar200._0_16_);
              auVar200 = vcvtph2ps_f16c(auVar200._16_16_);
              auVar198 = vcvtph2ps_avx512vl(auVar201._0_16_);
              auVar201 = vcvtph2ps_f16c(auVar201._16_16_);
              uVar1 = *(undefined4 *)*pauVar138;
              auVar199._4_4_ = uVar1;
              auVar199._0_4_ = uVar1;
              auVar199._8_4_ = uVar1;
              auVar199._12_4_ = uVar1;
              auVar199._16_4_ = uVar1;
              auVar199._20_4_ = uVar1;
              auVar199._24_4_ = uVar1;
              auVar199._28_4_ = uVar1;
              auVar199 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar197,auVar199);
              auVar215 = ZEXT3264(auVar199);
              uVar1 = *(undefined4 *)(*pauVar138 + 4);
              auVar197._4_4_ = uVar1;
              auVar197._0_4_ = uVar1;
              auVar197._8_4_ = uVar1;
              auVar197._12_4_ = uVar1;
              auVar197._16_4_ = uVar1;
              auVar197._20_4_ = uVar1;
              auVar197._24_4_ = uVar1;
              auVar197._28_4_ = uVar1;
              auVar200 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar200,auVar197);
              auVar216 = ZEXT3264(auVar200);
              uVar1 = *(undefined4 *)(*pauVar138 + 8);
              auVar200._4_4_ = uVar1;
              auVar200._0_4_ = uVar1;
              auVar200._8_4_ = uVar1;
              auVar200._12_4_ = uVar1;
              auVar200._16_4_ = uVar1;
              auVar200._20_4_ = uVar1;
              auVar200._24_4_ = uVar1;
              auVar200._28_4_ = uVar1;
              auVar200 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar198,auVar200);
              in_ZMM17 = ZEXT3264(auVar200);
              uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
              auVar198._4_4_ = uVar1;
              auVar198._0_4_ = uVar1;
              auVar198._8_4_ = uVar1;
              auVar198._12_4_ = uVar1;
              auVar198._16_4_ = uVar1;
              auVar198._20_4_ = uVar1;
              auVar198._24_4_ = uVar1;
              auVar198._28_4_ = uVar1;
              auVar200 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar201,auVar198);
              in_ZMM16 = ZEXT3264(auVar200);
              auVar200 = vlddqu_avx(pauVar142[2]);
              auVar201 = vlddqu_avx(pauVar142[3]);
              auVar199 = vcvtph2ps_avx512vl(auVar200._0_16_);
              auVar200 = vcvtph2ps_f16c(auVar200._16_16_);
              auVar197 = vcvtph2ps_avx512vl(auVar201._0_16_);
              auVar201 = vcvtph2ps_f16c(auVar201._16_16_);
              uVar1 = *(undefined4 *)(*pauVar138 + 0x10);
              auVar57._4_4_ = uVar1;
              auVar57._0_4_ = uVar1;
              auVar57._8_4_ = uVar1;
              auVar57._12_4_ = uVar1;
              auVar57._16_4_ = uVar1;
              auVar57._20_4_ = uVar1;
              auVar57._24_4_ = uVar1;
              auVar57._28_4_ = uVar1;
              auVar199 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar199,auVar57);
              in_ZMM20 = ZEXT3264(auVar199);
              uVar1 = *(undefined4 *)(*pauVar138 + 0x14);
              auVar58._4_4_ = uVar1;
              auVar58._0_4_ = uVar1;
              auVar58._8_4_ = uVar1;
              auVar58._12_4_ = uVar1;
              auVar58._16_4_ = uVar1;
              auVar58._20_4_ = uVar1;
              auVar58._24_4_ = uVar1;
              auVar58._28_4_ = uVar1;
              auVar200 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar200,auVar58);
              in_ZMM19 = ZEXT3264(auVar200);
              uVar1 = *(undefined4 *)(*pauVar138 + 0x18);
              auVar59._4_4_ = uVar1;
              auVar59._0_4_ = uVar1;
              auVar59._8_4_ = uVar1;
              auVar59._12_4_ = uVar1;
              auVar59._16_4_ = uVar1;
              auVar59._20_4_ = uVar1;
              auVar59._24_4_ = uVar1;
              auVar59._28_4_ = uVar1;
              auVar200 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar197,auVar59);
              in_ZMM23 = ZEXT3264(auVar200);
              uVar1 = *(undefined4 *)(*pauVar138 + 0x1c);
              auVar60._4_4_ = uVar1;
              auVar60._0_4_ = uVar1;
              auVar60._8_4_ = uVar1;
              auVar60._12_4_ = uVar1;
              auVar60._16_4_ = uVar1;
              auVar60._20_4_ = uVar1;
              auVar60._24_4_ = uVar1;
              auVar60._28_4_ = uVar1;
              auVar200 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar201,auVar60);
              in_ZMM18 = ZEXT3264(auVar200);
              pauVar138 = pauVar138 + 1;
              pauVar142 = pauVar142 + 4;
              iVar145 = iVar145 + 8;
              uVar150 = uVar157 & 0xfffffff8;
            } while (iVar145 < (int)uVar157);
          }
          auVar200 = auVar216._0_32_;
          uVar151 = uVar150 | 3;
          while( true ) {
            auVar201 = auVar215._0_32_;
            if ((int)uVar157 <= (int)uVar151) break;
            auVar200 = vlddqu_avx(*pauVar142);
            auVar199 = vlddqu_avx(pauVar142[1]);
            auVar197 = vcvtph2ps_avx512vl(auVar200._0_16_);
            auVar200 = vcvtph2ps_f16c(auVar200._16_16_);
            auVar198 = vcvtph2ps_avx512vl(auVar199._0_16_);
            uVar1 = *(undefined4 *)*pauVar138;
            auVar61._4_4_ = uVar1;
            auVar61._0_4_ = uVar1;
            auVar61._8_4_ = uVar1;
            auVar61._12_4_ = uVar1;
            auVar61._16_4_ = uVar1;
            auVar61._20_4_ = uVar1;
            auVar61._24_4_ = uVar1;
            auVar61._28_4_ = uVar1;
            auVar201 = vfmadd231ps_avx512vl(auVar201,auVar197,auVar61);
            auVar215 = ZEXT3264(auVar201);
            uVar1 = *(undefined4 *)(*pauVar138 + 4);
            auVar62._4_4_ = uVar1;
            auVar62._0_4_ = uVar1;
            auVar62._8_4_ = uVar1;
            auVar62._12_4_ = uVar1;
            auVar62._16_4_ = uVar1;
            auVar62._20_4_ = uVar1;
            auVar62._24_4_ = uVar1;
            auVar62._28_4_ = uVar1;
            auVar200 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar200,auVar62);
            auVar216 = ZEXT3264(auVar200);
            uVar1 = *(undefined4 *)(*pauVar138 + 8);
            auVar63._4_4_ = uVar1;
            auVar63._0_4_ = uVar1;
            auVar63._8_4_ = uVar1;
            auVar63._12_4_ = uVar1;
            auVar63._16_4_ = uVar1;
            auVar63._20_4_ = uVar1;
            auVar63._24_4_ = uVar1;
            auVar63._28_4_ = uVar1;
            auVar201 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar198,auVar63);
            in_ZMM17 = ZEXT3264(auVar201);
            auVar201 = vcvtph2ps_f16c(auVar199._16_16_);
            uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
            auVar64._4_4_ = uVar1;
            auVar64._0_4_ = uVar1;
            auVar64._8_4_ = uVar1;
            auVar64._12_4_ = uVar1;
            auVar64._16_4_ = uVar1;
            auVar64._20_4_ = uVar1;
            auVar64._24_4_ = uVar1;
            auVar64._28_4_ = uVar1;
            auVar201 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar201,auVar64);
            in_ZMM16 = ZEXT3264(auVar201);
            pauVar138 = (undefined1 (*) [32])(*pauVar138 + 0x10);
            pauVar142 = pauVar142 + 2;
            uVar151 = uVar150 + 7;
            uVar150 = uVar150 + 4;
          }
          if (uVar157 - uVar150 != 0 && (int)uVar150 <= (int)uVar157) {
            lVar146 = 0;
            do {
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])*pauVar142);
              auVar201 = vcvtph2ps_f16c(auVar163);
              uVar1 = *(undefined4 *)(*pauVar138 + lVar146 * 4);
              auVar65._4_4_ = uVar1;
              auVar65._0_4_ = uVar1;
              auVar65._8_4_ = uVar1;
              auVar65._12_4_ = uVar1;
              auVar65._16_4_ = uVar1;
              auVar65._20_4_ = uVar1;
              auVar65._24_4_ = uVar1;
              auVar65._28_4_ = uVar1;
              auVar201 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar201,auVar65);
              auVar215 = ZEXT3264(auVar201);
              pauVar142 = (undefined1 (*) [32])(*pauVar142 + 0x10);
              lVar146 = lVar146 + 1;
            } while (uVar157 - uVar150 != (int)lVar146);
          }
          auVar199 = vaddps_avx512vl(in_ZMM23._0_32_,in_ZMM18._0_32_);
          auVar197 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
          auVar198 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM17._0_32_);
          auVar207._0_4_ =
               auVar199._0_4_ + auVar197._0_4_ + auVar200._0_4_ + auVar198._0_4_ + auVar201._0_4_;
          auVar207._4_4_ =
               auVar199._4_4_ + auVar197._4_4_ + auVar200._4_4_ + auVar198._4_4_ + auVar201._4_4_;
          auVar207._8_4_ =
               auVar199._8_4_ + auVar197._8_4_ + auVar200._8_4_ + auVar198._8_4_ + auVar201._8_4_;
          auVar207._12_4_ =
               auVar199._12_4_ + auVar197._12_4_ + auVar200._12_4_ + auVar198._12_4_ +
               auVar201._12_4_;
          auVar207._16_4_ =
               auVar199._16_4_ + auVar197._16_4_ + auVar200._16_4_ + auVar198._16_4_ +
               auVar201._16_4_;
          auVar207._20_4_ =
               auVar199._20_4_ + auVar197._20_4_ + auVar200._20_4_ + auVar198._20_4_ +
               auVar201._20_4_;
          auVar207._24_4_ =
               auVar199._24_4_ + auVar197._24_4_ + auVar200._24_4_ + auVar198._24_4_ +
               auVar201._24_4_;
          auVar207._28_4_ =
               auVar199._28_4_ + auVar197._28_4_ + auVar200._28_4_ + auVar198._28_4_ +
               auVar201._28_4_;
          if (iVar5 - 1U < 6) {
            auVar200 = ZEXT1632(ZEXT816(0) << 0x40);
            switch(iVar5) {
            case 1:
              auVar207 = vmaxps_avx(auVar207,ZEXT1632(ZEXT816(0) << 0x40));
              break;
            case 2:
              auVar201 = vmaxps_avx(auVar207,auVar200);
              auVar200 = vminps_avx(auVar207,auVar200);
              uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
              auVar79._4_4_ = uVar1;
              auVar79._0_4_ = uVar1;
              auVar79._8_4_ = uVar1;
              auVar79._12_4_ = uVar1;
              auVar79._16_4_ = uVar1;
              auVar79._20_4_ = uVar1;
              auVar79._24_4_ = uVar1;
              auVar79._28_4_ = uVar1;
              auVar207 = vfmadd132ps_avx512vl(auVar200,auVar201,auVar79);
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
              auVar77._4_4_ = uVar1;
              auVar77._0_4_ = uVar1;
              auVar77._8_4_ = uVar1;
              auVar77._12_4_ = uVar1;
              auVar77._16_4_ = uVar1;
              auVar77._20_4_ = uVar1;
              auVar77._24_4_ = uVar1;
              auVar77._28_4_ = uVar1;
              auVar200 = vmaxps_avx512vl(auVar207,auVar77);
              uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
              auVar78._4_4_ = uVar1;
              auVar78._0_4_ = uVar1;
              auVar78._8_4_ = uVar1;
              auVar78._12_4_ = uVar1;
              auVar78._16_4_ = uVar1;
              auVar78._20_4_ = uVar1;
              auVar78._24_4_ = uVar1;
              auVar78._28_4_ = uVar1;
              auVar207 = vminps_avx512vl(auVar200,auVar78);
              break;
            case 4:
              auVar75._8_4_ = 0x80000000;
              auVar75._0_8_ = 0x8000000080000000;
              auVar75._12_4_ = 0x80000000;
              auVar75._16_4_ = 0x80000000;
              auVar75._20_4_ = 0x80000000;
              auVar75._24_4_ = 0x80000000;
              auVar75._28_4_ = 0x80000000;
              auVar200 = vxorps_avx512vl(auVar207,auVar75);
              auVar200 = vminps_avx512vl(auVar200,auVar189);
              auVar201 = vmaxps_avx512vl(auVar200,auVar190);
              auVar163 = vfmadd231ps_fma(auVar260,auVar201,auVar291);
              auVar200 = vroundps_avx(ZEXT1632(auVar163),1);
              uVar13 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar200,1);
              auVar199 = vsubps_avx512vl(auVar200,auVar296);
              bVar11 = (bool)((byte)uVar13 & 1);
              auVar208._0_4_ =
                   (float)((uint)bVar11 * auVar199._0_4_ | (uint)!bVar11 * auVar200._0_4_);
              bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar208._4_4_ =
                   (float)((uint)bVar11 * auVar199._4_4_ | (uint)!bVar11 * auVar200._4_4_);
              bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar208._8_4_ =
                   (float)((uint)bVar11 * auVar199._8_4_ | (uint)!bVar11 * auVar200._8_4_);
              bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar208._12_4_ =
                   (float)((uint)bVar11 * auVar199._12_4_ | (uint)!bVar11 * auVar200._12_4_);
              bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
              auVar208._16_4_ =
                   (float)((uint)bVar11 * auVar199._16_4_ | (uint)!bVar11 * auVar200._16_4_);
              bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
              auVar208._20_4_ =
                   (float)((uint)bVar11 * auVar199._20_4_ | (uint)!bVar11 * auVar200._20_4_);
              bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
              auVar208._24_4_ =
                   (float)((uint)bVar11 * auVar199._24_4_ | (uint)!bVar11 * auVar200._24_4_);
              bVar11 = SUB81(uVar13 >> 7,0);
              auVar208._28_4_ =
                   (float)((uint)bVar11 * auVar199._28_4_ | (uint)!bVar11 * auVar200._28_4_);
              auVar163 = vfmsub231ps_fma(auVar201,auVar208,auVar301);
              auVar76._8_4_ = 0x395e8083;
              auVar76._0_8_ = 0x395e8083395e8083;
              auVar76._12_4_ = 0x395e8083;
              auVar76._16_4_ = 0x395e8083;
              auVar76._20_4_ = 0x395e8083;
              auVar76._24_4_ = 0x395e8083;
              auVar76._28_4_ = 0x395e8083;
              auVar200 = vfmsub231ps_avx512vl(ZEXT1632(auVar163),auVar208,auVar76);
              auVar254._0_4_ = auVar200._0_4_ * auVar200._0_4_;
              auVar254._4_4_ = auVar200._4_4_ * auVar200._4_4_;
              auVar254._8_4_ = auVar200._8_4_ * auVar200._8_4_;
              auVar254._12_4_ = auVar200._12_4_ * auVar200._12_4_;
              auVar254._16_4_ = auVar200._16_4_ * auVar200._16_4_;
              auVar254._20_4_ = auVar200._20_4_ * auVar200._20_4_;
              auVar254._24_4_ = auVar200._24_4_ * auVar200._24_4_;
              auVar254._28_4_ = 0;
              auVar163 = vfmadd213ps_fma(auVar309,auVar200,auVar313);
              auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar200,auVar317);
              auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar200,auVar321);
              auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar200,auVar326);
              auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar200,auVar260);
              auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar254,auVar200);
              auVar255._0_4_ = auVar163._0_4_ + 1.0;
              auVar255._4_4_ = auVar163._4_4_ + 1.0;
              auVar255._8_4_ = auVar163._8_4_ + 1.0;
              auVar255._12_4_ = auVar163._12_4_ + 1.0;
              auVar255._16_4_ = 0x3f800000;
              auVar255._20_4_ = 0x3f800000;
              auVar255._24_4_ = 0x3f800000;
              auVar255._28_4_ = 0x3f800000;
              auVar239._0_4_ = (int)auVar208._0_4_;
              auVar239._4_4_ = (int)auVar208._4_4_;
              auVar239._8_4_ = (int)auVar208._8_4_;
              auVar239._12_4_ = (int)auVar208._12_4_;
              auVar239._16_4_ = (int)auVar208._16_4_;
              auVar239._20_4_ = (int)auVar208._20_4_;
              auVar239._24_4_ = (int)auVar208._24_4_;
              auVar239._28_4_ = (int)auVar208._28_4_;
              auVar200 = vpslld_avx2(auVar239,0x17);
              auVar200 = vpaddd_avx2(auVar329,auVar200);
              auVar163 = vfmadd213ps_fma(auVar200,auVar255,auVar296);
              auVar200 = vrcpps_avx(ZEXT1632(auVar163));
              auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar200,auVar296);
              auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar200,auVar200);
              auVar207 = ZEXT1632(auVar163);
              break;
            case 5:
              auVar201 = vminps_avx512vl(auVar207,auVar189);
              auVar199 = vmaxps_avx512vl(auVar201,auVar190);
              auVar163 = vfmadd213ps_fma(auVar291,auVar199,auVar260);
              auVar201 = vroundps_avx(ZEXT1632(auVar163),1);
              uVar13 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar201,1);
              auVar197 = vsubps_avx512vl(auVar201,auVar296);
              bVar11 = (bool)((byte)uVar13 & 1);
              auVar202._0_4_ =
                   (float)((uint)bVar11 * auVar197._0_4_ | (uint)!bVar11 * auVar201._0_4_);
              bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar202._4_4_ =
                   (float)((uint)bVar11 * auVar197._4_4_ | (uint)!bVar11 * auVar201._4_4_);
              bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar202._8_4_ =
                   (float)((uint)bVar11 * auVar197._8_4_ | (uint)!bVar11 * auVar201._8_4_);
              bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar202._12_4_ =
                   (float)((uint)bVar11 * auVar197._12_4_ | (uint)!bVar11 * auVar201._12_4_);
              bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
              auVar202._16_4_ =
                   (float)((uint)bVar11 * auVar197._16_4_ | (uint)!bVar11 * auVar201._16_4_);
              bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
              auVar202._20_4_ =
                   (float)((uint)bVar11 * auVar197._20_4_ | (uint)!bVar11 * auVar201._20_4_);
              bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
              auVar202._24_4_ =
                   (float)((uint)bVar11 * auVar197._24_4_ | (uint)!bVar11 * auVar201._24_4_);
              bVar11 = SUB81(uVar13 >> 7,0);
              auVar202._28_4_ =
                   (float)((uint)bVar11 * auVar197._28_4_ | (uint)!bVar11 * auVar201._28_4_);
              auVar163 = vfmsub231ps_fma(auVar199,auVar202,auVar301);
              auVar163 = vfnmsub231ps_fma(ZEXT1632(auVar163),auVar202,auVar333);
              auVar199 = ZEXT1632(auVar163);
              auVar201 = vfmadd213ps_avx512vl(auVar309,auVar199,auVar313);
              auVar201 = vfmadd213ps_avx512vl(auVar201,auVar199,auVar317);
              auVar201 = vfmadd213ps_avx512vl(auVar201,auVar199,auVar321);
              auVar199 = ZEXT1632(auVar163);
              auVar201 = vfmadd213ps_avx512vl(auVar201,auVar199,auVar326);
              auVar201 = vfmadd213ps_avx512vl(auVar201,auVar199,auVar260);
              auVar201 = vfmadd213ps_avx512vl
                                   (auVar201,ZEXT1632(CONCAT412(auVar163._12_4_ * auVar163._12_4_,
                                                                CONCAT48(auVar163._8_4_ *
                                                                         auVar163._8_4_,
                                                                         CONCAT44(auVar163._4_4_ *
                                                                                  auVar163._4_4_,
                                                                                  auVar163._0_4_ *
                                                                                  auVar163._0_4_))))
                                    ,auVar199);
              auVar199 = vaddps_avx512vl(auVar201,auVar296);
              auVar275._0_4_ = (int)auVar202._0_4_;
              auVar275._4_4_ = (int)auVar202._4_4_;
              auVar275._8_4_ = (int)auVar202._8_4_;
              auVar275._12_4_ = (int)auVar202._12_4_;
              auVar275._16_4_ = (int)auVar202._16_4_;
              auVar275._20_4_ = (int)auVar202._20_4_;
              auVar275._24_4_ = (int)auVar202._24_4_;
              auVar275._28_4_ = (int)auVar202._28_4_;
              auVar201 = vpslld_avx2(auVar275,0x17);
              auVar201 = vpaddd_avx2(auVar329,auVar201);
              auVar163 = vfmadd213ps_fma(auVar201,auVar199,auVar296);
              uVar13 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar200,2);
              auVar66._8_4_ = 0x800000;
              auVar66._0_8_ = 0x80000000800000;
              auVar66._12_4_ = 0x800000;
              auVar66._16_4_ = 0x800000;
              auVar66._20_4_ = 0x800000;
              auVar66._24_4_ = 0x800000;
              auVar66._28_4_ = 0x800000;
              auVar200 = vmaxps_avx512vl(ZEXT1632(auVar163),auVar66);
              auVar197 = vpsrld_avx2(auVar200,0x17);
              auVar305._8_4_ = 0x807fffff;
              auVar305._0_8_ = 0x807fffff807fffff;
              auVar305._12_4_ = 0x807fffff;
              auVar305._16_4_ = 0x807fffff;
              auVar305._20_4_ = 0x807fffff;
              auVar305._24_4_ = 0x807fffff;
              auVar305._28_4_ = 0x807fffff;
              auVar67._8_4_ = 0x3f000000;
              auVar67._0_8_ = 0x3f0000003f000000;
              auVar67._12_4_ = 0x3f000000;
              auVar67._16_4_ = 0x3f000000;
              auVar67._20_4_ = 0x3f000000;
              auVar67._24_4_ = 0x3f000000;
              auVar67._28_4_ = 0x3f000000;
              auVar200 = vpternlogd_avx512vl(auVar200,auVar305,auVar67,0xea);
              auVar68._8_4_ = 0x3f3504f3;
              auVar68._0_8_ = 0x3f3504f33f3504f3;
              auVar68._12_4_ = 0x3f3504f3;
              auVar68._16_4_ = 0x3f3504f3;
              auVar68._20_4_ = 0x3f3504f3;
              auVar68._24_4_ = 0x3f3504f3;
              auVar68._28_4_ = 0x3f3504f3;
              uVar14 = vcmpps_avx512vl(auVar200,auVar68,1);
              auVar201 = vaddps_avx512vl(auVar200,auVar191);
              auVar199 = vaddps_avx512vl(auVar201,auVar200);
              bVar11 = (bool)((byte)uVar14 & 1);
              auVar203._0_4_ =
                   (float)((uint)bVar11 * auVar199._0_4_ | (uint)!bVar11 * auVar201._0_4_);
              bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar203._4_4_ =
                   (float)((uint)bVar11 * auVar199._4_4_ | (uint)!bVar11 * auVar201._4_4_);
              bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar203._8_4_ =
                   (float)((uint)bVar11 * auVar199._8_4_ | (uint)!bVar11 * auVar201._8_4_);
              bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
              auVar203._12_4_ =
                   (float)((uint)bVar11 * auVar199._12_4_ | (uint)!bVar11 * auVar201._12_4_);
              bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
              auVar203._16_4_ =
                   (float)((uint)bVar11 * auVar199._16_4_ | (uint)!bVar11 * auVar201._16_4_);
              bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
              auVar203._20_4_ =
                   (float)((uint)bVar11 * auVar199._20_4_ | (uint)!bVar11 * auVar201._20_4_);
              bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
              auVar203._24_4_ =
                   (float)((uint)bVar11 * auVar199._24_4_ | (uint)!bVar11 * auVar201._24_4_);
              bVar11 = SUB81(uVar14 >> 7,0);
              auVar203._28_4_ = (uint)bVar11 * auVar199._28_4_ | (uint)!bVar11 * auVar201._28_4_;
              auVar114._4_4_ = auVar203._4_4_ * auVar203._4_4_;
              auVar114._0_4_ = auVar203._0_4_ * auVar203._0_4_;
              auVar114._8_4_ = auVar203._8_4_ * auVar203._8_4_;
              auVar114._12_4_ = auVar203._12_4_ * auVar203._12_4_;
              auVar114._16_4_ = auVar203._16_4_ * auVar203._16_4_;
              auVar114._20_4_ = auVar203._20_4_ * auVar203._20_4_;
              auVar114._24_4_ = auVar203._24_4_ * auVar203._24_4_;
              auVar114._28_4_ = auVar200._28_4_;
              auVar69._8_4_ = 0xbdebd1b8;
              auVar69._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar69._12_4_ = 0xbdebd1b8;
              auVar69._16_4_ = 0xbdebd1b8;
              auVar69._20_4_ = 0xbdebd1b8;
              auVar69._24_4_ = 0xbdebd1b8;
              auVar69._28_4_ = 0xbdebd1b8;
              auVar200 = vfmadd213ps_avx512vl(auVar192,auVar203,auVar69);
              auVar70._8_4_ = 0x3def251a;
              auVar70._0_8_ = 0x3def251a3def251a;
              auVar70._12_4_ = 0x3def251a;
              auVar70._16_4_ = 0x3def251a;
              auVar70._20_4_ = 0x3def251a;
              auVar70._24_4_ = 0x3def251a;
              auVar70._28_4_ = 0x3def251a;
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar203,auVar70);
              auVar71._8_4_ = 0xbdfe5d4f;
              auVar71._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar71._12_4_ = 0xbdfe5d4f;
              auVar71._16_4_ = 0xbdfe5d4f;
              auVar71._20_4_ = 0xbdfe5d4f;
              auVar71._24_4_ = 0xbdfe5d4f;
              auVar71._28_4_ = 0xbdfe5d4f;
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar203,auVar71);
              auVar72._8_4_ = 0x3e11e9bf;
              auVar72._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar72._12_4_ = 0x3e11e9bf;
              auVar72._16_4_ = 0x3e11e9bf;
              auVar72._20_4_ = 0x3e11e9bf;
              auVar72._24_4_ = 0x3e11e9bf;
              auVar72._28_4_ = 0x3e11e9bf;
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar203,auVar72);
              auVar73._8_4_ = 0xbe2aae50;
              auVar73._0_8_ = 0xbe2aae50be2aae50;
              auVar73._12_4_ = 0xbe2aae50;
              auVar73._16_4_ = 0xbe2aae50;
              auVar73._20_4_ = 0xbe2aae50;
              auVar73._24_4_ = 0xbe2aae50;
              auVar73._28_4_ = 0xbe2aae50;
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar203,auVar73);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar203,auVar193);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar203,auVar194);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar203,auVar195);
              auVar201 = vmulps_avx512vl(auVar114,auVar203);
              in_ZMM17 = ZEXT3264(auVar201);
              auVar201 = vmulps_avx512vl(auVar201,auVar200);
              auVar74._8_4_ = 0xffffff82;
              auVar74._0_8_ = 0xffffff82ffffff82;
              auVar74._12_4_ = 0xffffff82;
              auVar74._16_4_ = 0xffffff82;
              auVar74._20_4_ = 0xffffff82;
              auVar74._24_4_ = 0xffffff82;
              auVar74._28_4_ = 0xffffff82;
              auVar200 = vpaddd_avx512vl(auVar197,auVar74);
              auVar200 = vcvtdq2ps_avx(auVar200);
              auVar199 = vsubps_avx512vl(auVar200,auVar296);
              bVar11 = (bool)((byte)uVar14 & 1);
              auVar204._0_4_ = (uint)bVar11 * auVar199._0_4_ | (uint)!bVar11 * auVar200._0_4_;
              bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar204._4_4_ = (uint)bVar11 * auVar199._4_4_ | (uint)!bVar11 * auVar200._4_4_;
              bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar204._8_4_ = (uint)bVar11 * auVar199._8_4_ | (uint)!bVar11 * auVar200._8_4_;
              bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
              auVar204._12_4_ = (uint)bVar11 * auVar199._12_4_ | (uint)!bVar11 * auVar200._12_4_;
              bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
              auVar204._16_4_ = (uint)bVar11 * auVar199._16_4_ | (uint)!bVar11 * auVar200._16_4_;
              bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
              auVar204._20_4_ = (uint)bVar11 * auVar199._20_4_ | (uint)!bVar11 * auVar200._20_4_;
              bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
              auVar204._24_4_ = (uint)bVar11 * auVar199._24_4_ | (uint)!bVar11 * auVar200._24_4_;
              bVar11 = SUB81(uVar14 >> 7,0);
              auVar204._28_4_ = (uint)bVar11 * auVar199._28_4_ | (uint)!bVar11 * auVar200._28_4_;
              auVar200 = vfmadd231ps_avx512vl(auVar201,auVar204,auVar333);
              auVar200 = vfmsub231ps_avx512vl(auVar200,auVar260,auVar114);
              auVar200 = vsubps_avx512vl(auVar200,auVar203);
              auVar163 = vfmsub231ps_fma(auVar200,auVar301,auVar204);
              auVar200 = vmulps_avx512vl(ZEXT1632(auVar163),auVar196);
              auVar201 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar11 = (bool)((byte)uVar13 & 1);
              auVar205._0_4_ = (uint)bVar11 * auVar201._0_4_ | (uint)!bVar11 * auVar200._0_4_;
              bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar205._4_4_ = (uint)bVar11 * auVar201._4_4_ | (uint)!bVar11 * auVar200._4_4_;
              bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar205._8_4_ = (uint)bVar11 * auVar201._8_4_ | (uint)!bVar11 * auVar200._8_4_;
              bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar205._12_4_ = (uint)bVar11 * auVar201._12_4_ | (uint)!bVar11 * auVar200._12_4_;
              bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
              auVar205._16_4_ = (uint)bVar11 * auVar201._16_4_ | (uint)!bVar11 * auVar200._16_4_;
              bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
              auVar205._20_4_ = (uint)bVar11 * auVar201._20_4_ | (uint)!bVar11 * auVar200._20_4_;
              bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
              auVar205._24_4_ = (uint)bVar11 * auVar201._24_4_ | (uint)!bVar11 * auVar200._24_4_;
              bVar11 = SUB81(uVar13 >> 7,0);
              auVar205._28_4_ = (uint)bVar11 * auVar201._28_4_ | (uint)!bVar11 * auVar200._28_4_;
              auVar200 = vminps_avx512vl(auVar205,auVar189);
              auVar201 = vmaxps_avx512vl(auVar200,auVar190);
              auVar163 = vfmadd213ps_fma(auVar291,auVar201,auVar260);
              auVar200 = vroundps_avx(ZEXT1632(auVar163),1);
              uVar13 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar200,1);
              auVar199 = vsubps_avx512vl(auVar200,auVar296);
              bVar11 = (bool)((byte)uVar13 & 1);
              auVar206._0_4_ =
                   (float)((uint)bVar11 * auVar199._0_4_ | (uint)!bVar11 * auVar200._0_4_);
              bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
              auVar206._4_4_ =
                   (float)((uint)bVar11 * auVar199._4_4_ | (uint)!bVar11 * auVar200._4_4_);
              bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
              auVar206._8_4_ =
                   (float)((uint)bVar11 * auVar199._8_4_ | (uint)!bVar11 * auVar200._8_4_);
              bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
              auVar206._12_4_ =
                   (float)((uint)bVar11 * auVar199._12_4_ | (uint)!bVar11 * auVar200._12_4_);
              bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
              auVar206._16_4_ =
                   (float)((uint)bVar11 * auVar199._16_4_ | (uint)!bVar11 * auVar200._16_4_);
              bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
              auVar206._20_4_ =
                   (float)((uint)bVar11 * auVar199._20_4_ | (uint)!bVar11 * auVar200._20_4_);
              bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
              auVar206._24_4_ =
                   (float)((uint)bVar11 * auVar199._24_4_ | (uint)!bVar11 * auVar200._24_4_);
              bVar11 = SUB81(uVar13 >> 7,0);
              auVar206._28_4_ =
                   (float)((uint)bVar11 * auVar199._28_4_ | (uint)!bVar11 * auVar200._28_4_);
              auVar163 = vfmsub231ps_fma(auVar201,auVar206,auVar301);
              auVar163 = vfnmsub231ps_fma(ZEXT1632(auVar163),auVar206,auVar333);
              auVar201 = ZEXT1632(auVar163);
              auVar200 = vfmadd213ps_avx512vl(auVar309,auVar201,auVar313);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar201,auVar317);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar201,auVar321);
              auVar201 = ZEXT1632(auVar163);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar201,auVar326);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar201,auVar260);
              auVar200 = vfmadd213ps_avx512vl
                                   (auVar200,ZEXT1632(CONCAT412(auVar163._12_4_ * auVar163._12_4_,
                                                                CONCAT48(auVar163._8_4_ *
                                                                         auVar163._8_4_,
                                                                         CONCAT44(auVar163._4_4_ *
                                                                                  auVar163._4_4_,
                                                                                  auVar163._0_4_ *
                                                                                  auVar163._0_4_))))
                                    ,auVar201);
              in_ZMM16 = ZEXT3264(auVar200);
              auVar201 = vaddps_avx512vl(auVar200,auVar296);
              auVar276._0_4_ = (int)auVar206._0_4_;
              auVar276._4_4_ = (int)auVar206._4_4_;
              auVar276._8_4_ = (int)auVar206._8_4_;
              auVar276._12_4_ = (int)auVar206._12_4_;
              auVar276._16_4_ = (int)auVar206._16_4_;
              auVar276._20_4_ = (int)auVar206._20_4_;
              auVar276._24_4_ = (int)auVar206._24_4_;
              auVar276._28_4_ = (int)auVar206._28_4_;
              auVar200 = vpslld_avx2(auVar276,0x17);
              auVar200 = vpaddd_avx2(auVar329,auVar200);
              auVar163 = vfmadd213ps_fma(auVar200,auVar201,auVar296);
              auVar200 = vrcpps_avx(ZEXT1632(auVar163));
              auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar200,auVar296);
              auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar200,auVar200);
              auVar200 = vfnmadd213ps_avx512vl(ZEXT1632(auVar163),auVar196,auVar191);
              auVar207._4_4_ = auVar200._4_4_ * auVar207._4_4_;
              auVar207._0_4_ = auVar200._0_4_ * auVar207._0_4_;
              auVar207._8_4_ = auVar200._8_4_ * auVar207._8_4_;
              auVar207._12_4_ = auVar200._12_4_ * auVar207._12_4_;
              auVar207._16_4_ = auVar200._16_4_ * auVar207._16_4_;
              auVar207._20_4_ = auVar200._20_4_ * auVar207._20_4_;
              auVar207._24_4_ = auVar200._24_4_ * auVar207._24_4_;
              break;
            case 6:
              uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
              auVar256._4_4_ = uVar1;
              auVar256._0_4_ = uVar1;
              auVar256._8_4_ = uVar1;
              auVar256._12_4_ = uVar1;
              auVar256._16_4_ = uVar1;
              auVar256._20_4_ = uVar1;
              auVar256._24_4_ = uVar1;
              auVar256._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
              auVar201._4_4_ = uVar1;
              auVar201._0_4_ = uVar1;
              auVar201._8_4_ = uVar1;
              auVar201._12_4_ = uVar1;
              auVar201._16_4_ = uVar1;
              auVar201._20_4_ = uVar1;
              auVar201._24_4_ = uVar1;
              auVar201._28_4_ = uVar1;
              auVar201 = vfmadd213ps_avx512vl(auVar256,auVar207,auVar201);
              auVar200 = vmaxps_avx(auVar201,auVar200);
              auVar200 = vminps_avx(auVar200,auVar296);
              auVar207._4_4_ = auVar200._4_4_ * auVar207._4_4_;
              auVar207._0_4_ = auVar200._0_4_ * auVar207._0_4_;
              auVar207._8_4_ = auVar200._8_4_ * auVar207._8_4_;
              auVar207._12_4_ = auVar200._12_4_ * auVar207._12_4_;
              auVar207._16_4_ = auVar200._16_4_ * auVar207._16_4_;
              auVar207._20_4_ = auVar200._20_4_ * auVar207._20_4_;
              auVar207._24_4_ = auVar200._24_4_ * auVar207._24_4_;
            }
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar136 * 0x20) = auVar207;
          uVar136 = uVar136 + 1;
        } while (uVar136 != uVar156);
      }
    }
    if (iVar133 == 1) {
      if (0 < (int)uVar134 >> 3) {
        local_220 = (ulong)(uint)((int)uVar134 >> 3);
        lVar146 = 7;
        lVar141 = 6;
        lVar143 = 5;
        lVar144 = 4;
        lVar147 = 3;
        lVar137 = 2;
        lVar159 = 1;
        local_300 = 0;
        uVar156 = 0;
        do {
          uVar136 = uVar156 * 8;
          auVar215 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar8 != 0) {
            auVar215 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar156 * 0x20));
          }
          auVar189 = auVar215._0_32_;
          lVar135 = (long)(this->weight_data_tm).w;
          pvVar9 = (this->weight_data_tm).data;
          sVar10 = (this->weight_data_tm).elemsize;
          pauVar142 = local_3b8;
          if ((int)uVar157 < 8) {
            lVar135 = sVar10 * lVar135;
            lVar139 = lVar135 * uVar136;
            lVar149 = (uVar136 | 1) * lVar135;
            lVar148 = (uVar136 | 2) * lVar135;
            lVar155 = (uVar136 | 3) * lVar135;
            lVar154 = (uVar136 | 4) * lVar135;
            lVar153 = (uVar136 | 5) * lVar135;
            lVar152 = (uVar136 | 6) * lVar135;
            lVar162 = (uVar136 | 7) * lVar135;
            uVar150 = 0;
            local_b8 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_118 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar162 = sVar10 * lVar146 * lVar135;
            lVar152 = sVar10 * lVar141 * lVar135;
            lVar153 = sVar10 * lVar143 * lVar135;
            lVar154 = sVar10 * lVar144 * lVar135;
            lVar155 = sVar10 * lVar147 * lVar135;
            lVar148 = sVar10 * lVar137 * lVar135;
            lVar149 = sVar10 * lVar159 * lVar135;
            lVar135 = sVar10 * local_300 * lVar135;
            local_2b8._0_8_ = lVar135;
            auVar216 = ZEXT864(0);
            auVar335 = ZEXT864(0);
            auVar338 = ZEXT864(0);
            auVar221 = ZEXT864(0);
            auVar220 = ZEXT864(0);
            auVar219 = ZEXT864(0);
            auVar218 = ZEXT864(0);
            auVar217 = ZEXT864(0);
            iVar145 = 7;
            lVar139 = 0;
            do {
              auVar190 = *(undefined1 (*) [32])(*local_3b8 + lVar139 * 2);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar139 + lVar135));
              auVar191 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar139 + lVar149));
              auVar192 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar139 + lVar148));
              auVar193 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar139 + lVar155));
              auVar194 = vcvtph2ps_f16c(auVar163);
              auVar163 = vfmadd231ps_fma(auVar216._0_32_,auVar190,auVar191);
              auVar216 = ZEXT1664(auVar163);
              local_98 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar335._0_32_,auVar190,auVar192);
              auVar335 = ZEXT1664(auVar163);
              local_178 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar338._0_32_,auVar190,auVar193);
              auVar338 = ZEXT1664(auVar163);
              local_158 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar221._0_32_,auVar190,auVar194);
              auVar221 = ZEXT1664(auVar163);
              local_138 = ZEXT1632(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar139 + lVar154));
              auVar191 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar139 + lVar153));
              auVar192 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar139 + lVar152));
              auVar193 = vcvtph2ps_f16c(auVar163);
              auVar163 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar139 + lVar162));
              auVar194 = vcvtph2ps_f16c(auVar163);
              auVar163 = vfmadd231ps_fma(auVar220._0_32_,auVar190,auVar191);
              auVar220 = ZEXT1664(auVar163);
              local_118 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar219._0_32_,auVar190,auVar192);
              auVar219 = ZEXT1664(auVar163);
              local_f8 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar218._0_32_,auVar190,auVar193);
              auVar218 = ZEXT1664(auVar163);
              local_d8 = ZEXT1632(auVar163);
              auVar163 = vfmadd231ps_fma(auVar217._0_32_,auVar190,auVar194);
              auVar217 = ZEXT1664(auVar163);
              local_b8 = ZEXT1632(auVar163);
              pauVar142 = pauVar142 + 1;
              iVar145 = iVar145 + 8;
              lVar139 = lVar139 + 0x10;
            } while (iVar145 < (int)uVar157);
            lVar162 = lVar162 + lVar139;
            lVar152 = lVar152 + lVar139;
            lVar153 = lVar153 + lVar139;
            lVar154 = lVar154 + lVar139;
            lVar155 = lVar155 + lVar139;
            lVar148 = lVar148 + lVar139;
            lVar149 = lVar149 + lVar139;
            lVar139 = lVar135 + lVar139;
            uVar150 = uVar157 & 0xfffffff8;
          }
          local_348._0_8_ = (long)pvVar9 + lVar149;
          local_358._0_8_ = (long)pvVar9 + lVar148;
          local_368._0_8_ = (long)pvVar9 + lVar155;
          local_2f8 = uVar156;
          local_2f0 = lVar159;
          local_2e8 = lVar137;
          local_2e0 = lVar147;
          local_2d8 = lVar144;
          local_2d0 = lVar143;
          local_2c8 = lVar141;
          local_2c0 = lVar146;
          if ((int)uVar150 < (int)uVar157) {
            lVar146 = 0;
            do {
              local_2b8 = auVar215._0_32_;
              local_318 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
              fVar263 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar146 * 2 + lVar139)
                                          );
              auVar189 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar263;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar189._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              _local_328 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
              fVar263 = float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar146 * 2));
              local_238 = CONCAT44(extraout_XMM0_Db_00,fVar263);
              local_338 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
              local_248._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_358._0_8_ + lVar146 * 2));
              local_248._4_4_ = extraout_XMM0_Db_01;
              local_248._8_4_ = extraout_XMM0_Dc_00;
              local_248._12_4_ = extraout_XMM0_Dd_00;
              local_258 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
              local_268._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_368._0_8_ + lVar146 * 2));
              local_268._4_4_ = extraout_XMM0_Db_02;
              local_268._8_4_ = extraout_XMM0_Dc_01;
              local_268._12_4_ = extraout_XMM0_Dd_01;
              local_278 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
              local_288 = float16_to_float32(*(unsigned_short *)
                                              ((long)pvVar9 + lVar146 * 2 + lVar154));
              local_198._0_16_ = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
              uStack_284 = extraout_XMM0_Db_03;
              uStack_280 = extraout_XMM0_Dc_02;
              uStack_27c = extraout_XMM0_Dd_02;
              fVar263 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar146 * 2 + lVar153)
                                          );
              auVar189 = local_1b8;
              local_1b8._4_4_ = extraout_XMM0_Db_04;
              local_1b8._0_4_ = fVar263;
              local_1b8._8_4_ = extraout_XMM0_Dc_03;
              local_1b8._16_16_ = auVar189._16_16_;
              local_1b8._12_4_ = extraout_XMM0_Dd_03;
              local_1d8._0_16_ = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
              fVar263 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar146 * 2 + lVar152)
                                          );
              auVar189 = local_1f8;
              local_1f8._4_4_ = extraout_XMM0_Db_05;
              local_1f8._0_4_ = fVar263;
              local_1f8._8_4_ = extraout_XMM0_Dc_04;
              local_1f8._16_16_ = auVar189._16_16_;
              local_1f8._12_4_ = extraout_XMM0_Dd_04;
              local_298 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
              auVar215._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar146 * 2 + lVar162));
              auVar215._4_60_ = extraout_var;
              auVar163._4_4_ = uStack_284;
              auVar163._0_4_ = local_288;
              auVar163._8_4_ = uStack_280;
              auVar163._12_4_ = uStack_27c;
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_1b8._0_4_),0x10);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_1f8._0_4_),0x20);
              auVar163 = vinsertps_avx(auVar163,auVar215._0_16_,0x30);
              auVar164 = vinsertps_avx(_local_218,ZEXT416((uint)local_238),0x10);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_248._0_4_),0x20);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_268._0_4_),0x30);
              auVar189._16_16_ = auVar163;
              auVar189._0_16_ = auVar164;
              auVar163 = vinsertps_avx(local_278,ZEXT416((uint)local_198._0_4_),0x10);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_298._0_4_),0x30);
              auVar164 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_338._0_4_),0x20);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_258._0_4_),0x30);
              auVar190._16_16_ = auVar163;
              auVar190._0_16_ = auVar164;
              auVar163 = vfmadd231ps_fma(local_2b8,auVar189,auVar190);
              auVar215 = ZEXT1664(auVar163);
              auVar189 = ZEXT1632(auVar163);
              lVar146 = lVar146 + 1;
            } while (uVar157 - uVar150 != (int)lVar146);
          }
          auVar190 = vhaddps_avx(local_98,local_178);
          auVar191 = vhaddps_avx(local_158,local_138);
          auVar191 = vhaddps_avx(auVar190,auVar191);
          auVar190 = vhaddps_avx(local_118,local_f8);
          auVar192 = vhaddps_avx(local_d8,local_b8);
          auVar192 = vhaddps_avx(auVar190,auVar192);
          auVar190 = vblendps_avx(auVar191,auVar192,0xf0);
          auVar192 = vperm2f128_avx(auVar191,auVar192,0x21);
          auVar191._0_4_ = auVar192._0_4_ + auVar189._0_4_ + auVar190._0_4_;
          auVar191._4_4_ = auVar192._4_4_ + auVar189._4_4_ + auVar190._4_4_;
          auVar191._8_4_ = auVar192._8_4_ + auVar189._8_4_ + auVar190._8_4_;
          auVar191._12_4_ = auVar192._12_4_ + auVar189._12_4_ + auVar190._12_4_;
          auVar191._16_4_ = auVar192._16_4_ + auVar189._16_4_ + auVar190._16_4_;
          auVar191._20_4_ = auVar192._20_4_ + auVar189._20_4_ + auVar190._20_4_;
          auVar191._24_4_ = auVar192._24_4_ + auVar189._24_4_ + auVar190._24_4_;
          auVar191._28_4_ = auVar192._28_4_ + auVar189._28_4_ + auVar190._28_4_;
          switch(iVar5) {
          case 1:
            auVar191 = vmaxps_avx(auVar191,_DAT_00593200);
            break;
          case 2:
            auVar189 = vmaxps_avx(auVar191,ZEXT832(0) << 0x20);
            auVar190 = vminps_avx(auVar191,ZEXT832(0) << 0x20);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar103._4_4_ = uVar1;
            auVar103._0_4_ = uVar1;
            auVar103._8_4_ = uVar1;
            auVar103._12_4_ = uVar1;
            auVar103._16_4_ = uVar1;
            auVar103._20_4_ = uVar1;
            auVar103._24_4_ = uVar1;
            auVar103._28_4_ = uVar1;
            auVar191 = vfmadd132ps_avx512vl(auVar190,auVar189,auVar103);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar101._4_4_ = uVar1;
            auVar101._0_4_ = uVar1;
            auVar101._8_4_ = uVar1;
            auVar101._12_4_ = uVar1;
            auVar101._16_4_ = uVar1;
            auVar101._20_4_ = uVar1;
            auVar101._24_4_ = uVar1;
            auVar101._28_4_ = uVar1;
            auVar189 = vmaxps_avx512vl(auVar191,auVar101);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar102._4_4_ = uVar1;
            auVar102._0_4_ = uVar1;
            auVar102._8_4_ = uVar1;
            auVar102._12_4_ = uVar1;
            auVar102._16_4_ = uVar1;
            auVar102._20_4_ = uVar1;
            auVar102._24_4_ = uVar1;
            auVar102._28_4_ = uVar1;
            auVar191 = vminps_avx512vl(auVar189,auVar102);
            break;
          case 4:
            auVar90._8_4_ = 0x80000000;
            auVar90._0_8_ = 0x8000000080000000;
            auVar90._12_4_ = 0x80000000;
            auVar90._16_4_ = 0x80000000;
            auVar90._20_4_ = 0x80000000;
            auVar90._24_4_ = 0x80000000;
            auVar90._28_4_ = 0x80000000;
            auVar189 = vxorps_avx512vl(auVar191,auVar90);
            auVar91._8_4_ = 0x42b0c0a5;
            auVar91._0_8_ = 0x42b0c0a542b0c0a5;
            auVar91._12_4_ = 0x42b0c0a5;
            auVar91._16_4_ = 0x42b0c0a5;
            auVar91._20_4_ = 0x42b0c0a5;
            auVar91._24_4_ = 0x42b0c0a5;
            auVar91._28_4_ = 0x42b0c0a5;
            auVar189 = vminps_avx512vl(auVar189,auVar91);
            auVar92._8_4_ = 0xc2b0c0a5;
            auVar92._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar92._12_4_ = 0xc2b0c0a5;
            auVar92._16_4_ = 0xc2b0c0a5;
            auVar92._20_4_ = 0xc2b0c0a5;
            auVar92._24_4_ = 0xc2b0c0a5;
            auVar92._28_4_ = 0xc2b0c0a5;
            auVar190 = vmaxps_avx512vl(auVar189,auVar92);
            auVar284._8_4_ = 0x3f000000;
            auVar284._0_8_ = 0x3f0000003f000000;
            auVar284._12_4_ = 0x3f000000;
            auVar284._16_4_ = 0x3f000000;
            auVar284._20_4_ = 0x3f000000;
            auVar284._24_4_ = 0x3f000000;
            auVar284._28_4_ = 0x3f000000;
            auVar93._8_4_ = 0x3fb8aa3b;
            auVar93._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar93._12_4_ = 0x3fb8aa3b;
            auVar93._16_4_ = 0x3fb8aa3b;
            auVar93._20_4_ = 0x3fb8aa3b;
            auVar93._24_4_ = 0x3fb8aa3b;
            auVar93._28_4_ = 0x3fb8aa3b;
            auVar191 = vfmadd231ps_avx512vl(auVar284,auVar190,auVar93);
            auVar189 = vroundps_avx(auVar191,1);
            uVar136 = vcmpps_avx512vl(auVar191,auVar189,1);
            auVar293._8_4_ = 0x3f800000;
            auVar293._0_8_ = 0x3f8000003f800000;
            auVar293._12_4_ = 0x3f800000;
            auVar293._16_4_ = 0x3f800000;
            auVar293._20_4_ = 0x3f800000;
            auVar293._24_4_ = 0x3f800000;
            auVar293._28_4_ = 0x3f800000;
            auVar192 = vsubps_avx512vl(auVar189,auVar293);
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar214._0_4_ = (float)((uint)bVar11 * auVar192._0_4_ | (uint)!bVar11 * auVar189._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar214._4_4_ = (float)((uint)bVar11 * auVar192._4_4_ | (uint)!bVar11 * auVar189._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar214._8_4_ = (float)((uint)bVar11 * auVar192._8_4_ | (uint)!bVar11 * auVar189._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar214._12_4_ =
                 (float)((uint)bVar11 * auVar192._12_4_ | (uint)!bVar11 * auVar189._12_4_);
            bVar11 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar214._16_4_ =
                 (float)((uint)bVar11 * auVar192._16_4_ | (uint)!bVar11 * auVar189._16_4_);
            bVar11 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar214._20_4_ =
                 (float)((uint)bVar11 * auVar192._20_4_ | (uint)!bVar11 * auVar189._20_4_);
            bVar11 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar214._24_4_ =
                 (float)((uint)bVar11 * auVar192._24_4_ | (uint)!bVar11 * auVar189._24_4_);
            bVar11 = SUB81(uVar136 >> 7,0);
            auVar214._28_4_ =
                 (float)((uint)bVar11 * auVar192._28_4_ | (uint)!bVar11 * auVar189._28_4_);
            auVar94._8_4_ = 0x3f318000;
            auVar94._0_8_ = 0x3f3180003f318000;
            auVar94._12_4_ = 0x3f318000;
            auVar94._16_4_ = 0x3f318000;
            auVar94._20_4_ = 0x3f318000;
            auVar94._24_4_ = 0x3f318000;
            auVar94._28_4_ = 0x3f318000;
            auVar189 = vfmsub231ps_avx512vl(auVar190,auVar214,auVar94);
            auVar95._8_4_ = 0x395e8083;
            auVar95._0_8_ = 0x395e8083395e8083;
            auVar95._12_4_ = 0x395e8083;
            auVar95._16_4_ = 0x395e8083;
            auVar95._20_4_ = 0x395e8083;
            auVar95._24_4_ = 0x395e8083;
            auVar95._28_4_ = 0x395e8083;
            auVar189 = vfmsub231ps_avx512vl(auVar189,auVar214,auVar95);
            auVar117._4_4_ = auVar189._4_4_ * auVar189._4_4_;
            auVar117._0_4_ = auVar189._0_4_ * auVar189._0_4_;
            auVar117._8_4_ = auVar189._8_4_ * auVar189._8_4_;
            auVar117._12_4_ = auVar189._12_4_ * auVar189._12_4_;
            auVar117._16_4_ = auVar189._16_4_ * auVar189._16_4_;
            auVar117._20_4_ = auVar189._20_4_ * auVar189._20_4_;
            auVar117._24_4_ = auVar189._24_4_ * auVar189._24_4_;
            auVar117._28_4_ = auVar191._28_4_;
            auVar278._8_4_ = 0x39506967;
            auVar278._0_8_ = 0x3950696739506967;
            auVar278._12_4_ = 0x39506967;
            auVar278._16_4_ = 0x39506967;
            auVar278._20_4_ = 0x39506967;
            auVar278._24_4_ = 0x39506967;
            auVar278._28_4_ = 0x39506967;
            auVar96._8_4_ = 0x3ab743ce;
            auVar96._0_8_ = 0x3ab743ce3ab743ce;
            auVar96._12_4_ = 0x3ab743ce;
            auVar96._16_4_ = 0x3ab743ce;
            auVar96._20_4_ = 0x3ab743ce;
            auVar96._24_4_ = 0x3ab743ce;
            auVar96._28_4_ = 0x3ab743ce;
            auVar190 = vfmadd213ps_avx512vl(auVar278,auVar189,auVar96);
            auVar97._8_4_ = 0x3c088908;
            auVar97._0_8_ = 0x3c0889083c088908;
            auVar97._12_4_ = 0x3c088908;
            auVar97._16_4_ = 0x3c088908;
            auVar97._20_4_ = 0x3c088908;
            auVar97._24_4_ = 0x3c088908;
            auVar97._28_4_ = 0x3c088908;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar97);
            auVar98._8_4_ = 0x3d2aa9c1;
            auVar98._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar98._12_4_ = 0x3d2aa9c1;
            auVar98._16_4_ = 0x3d2aa9c1;
            auVar98._20_4_ = 0x3d2aa9c1;
            auVar98._24_4_ = 0x3d2aa9c1;
            auVar98._28_4_ = 0x3d2aa9c1;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar98);
            auVar99._8_4_ = 0x3e2aaaaa;
            auVar99._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar99._12_4_ = 0x3e2aaaaa;
            auVar99._16_4_ = 0x3e2aaaaa;
            auVar99._20_4_ = 0x3e2aaaaa;
            auVar99._24_4_ = 0x3e2aaaaa;
            auVar99._28_4_ = 0x3e2aaaaa;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar189,auVar99);
            auVar163 = vfmadd213ps_fma(auVar190,auVar189,auVar284);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar117,auVar189);
            auVar242._0_4_ = auVar163._0_4_ + 1.0;
            auVar242._4_4_ = auVar163._4_4_ + 1.0;
            auVar242._8_4_ = auVar163._8_4_ + 1.0;
            auVar242._12_4_ = auVar163._12_4_ + 1.0;
            auVar242._16_4_ = 0x3f800000;
            auVar242._20_4_ = 0x3f800000;
            auVar242._24_4_ = 0x3f800000;
            auVar242._28_4_ = 0x3f800000;
            auVar234._0_4_ = (int)auVar214._0_4_;
            auVar234._4_4_ = (int)auVar214._4_4_;
            auVar234._8_4_ = (int)auVar214._8_4_;
            auVar234._12_4_ = (int)auVar214._12_4_;
            auVar234._16_4_ = (int)auVar214._16_4_;
            auVar234._20_4_ = (int)auVar214._20_4_;
            auVar234._24_4_ = (int)auVar214._24_4_;
            auVar234._28_4_ = (int)auVar214._28_4_;
            auVar189 = vpslld_avx2(auVar234,0x17);
            auVar100._8_4_ = 0x3f800000;
            auVar100._0_8_ = 0x3f8000003f800000;
            auVar100._12_4_ = 0x3f800000;
            auVar100._16_4_ = 0x3f800000;
            auVar100._20_4_ = 0x3f800000;
            auVar100._24_4_ = 0x3f800000;
            auVar100._28_4_ = 0x3f800000;
            auVar189 = vpaddd_avx512vl(auVar189,auVar100);
            auVar163 = vfmadd213ps_fma(auVar189,auVar242,auVar293);
            auVar189 = vrcpps_avx(ZEXT1632(auVar163));
            auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar189,auVar293);
            auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar189,auVar189);
            auVar191 = ZEXT1632(auVar163);
            break;
          case 5:
            auVar297._8_4_ = 0x42b0c0a5;
            auVar297._0_8_ = 0x42b0c0a542b0c0a5;
            auVar297._12_4_ = 0x42b0c0a5;
            auVar297._16_4_ = 0x42b0c0a5;
            auVar297._20_4_ = 0x42b0c0a5;
            auVar297._24_4_ = 0x42b0c0a5;
            auVar297._28_4_ = 0x42b0c0a5;
            auVar189 = vminps_avx(auVar191,auVar297);
            auVar302._8_4_ = 0xc2b0c0a5;
            auVar302._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar302._12_4_ = 0xc2b0c0a5;
            auVar302._16_4_ = 0xc2b0c0a5;
            auVar302._20_4_ = 0xc2b0c0a5;
            auVar302._24_4_ = 0xc2b0c0a5;
            auVar302._28_4_ = 0xc2b0c0a5;
            auVar189 = vmaxps_avx(auVar189,auVar302);
            auVar310._8_4_ = 0x3fb8aa3b;
            auVar310._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar310._12_4_ = 0x3fb8aa3b;
            auVar310._16_4_ = 0x3fb8aa3b;
            auVar310._20_4_ = 0x3fb8aa3b;
            auVar310._24_4_ = 0x3fb8aa3b;
            auVar310._28_4_ = 0x3fb8aa3b;
            auVar306._8_4_ = 0x3f000000;
            auVar306._0_8_ = 0x3f0000003f000000;
            auVar306._12_4_ = 0x3f000000;
            auVar306._16_4_ = 0x3f000000;
            auVar306._20_4_ = 0x3f000000;
            auVar306._24_4_ = 0x3f000000;
            auVar306._28_4_ = 0x3f000000;
            auVar163 = vfmadd213ps_fma(auVar310,auVar189,auVar306);
            auVar190 = vroundps_avx(ZEXT1632(auVar163),1);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar190,1);
            auVar314._8_4_ = 0x3f800000;
            auVar314._0_8_ = 0x3f8000003f800000;
            auVar314._12_4_ = 0x3f800000;
            auVar314._16_4_ = 0x3f800000;
            auVar314._20_4_ = 0x3f800000;
            auVar314._24_4_ = 0x3f800000;
            auVar314._28_4_ = 0x3f800000;
            auVar192 = vsubps_avx512vl(auVar190,auVar314);
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar209._0_4_ = (float)((uint)bVar11 * auVar192._0_4_ | (uint)!bVar11 * auVar190._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar209._4_4_ = (float)((uint)bVar11 * auVar192._4_4_ | (uint)!bVar11 * auVar190._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar209._8_4_ = (float)((uint)bVar11 * auVar192._8_4_ | (uint)!bVar11 * auVar190._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar209._12_4_ =
                 (float)((uint)bVar11 * auVar192._12_4_ | (uint)!bVar11 * auVar190._12_4_);
            bVar11 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar209._16_4_ =
                 (float)((uint)bVar11 * auVar192._16_4_ | (uint)!bVar11 * auVar190._16_4_);
            bVar11 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar209._20_4_ =
                 (float)((uint)bVar11 * auVar192._20_4_ | (uint)!bVar11 * auVar190._20_4_);
            bVar11 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar209._24_4_ =
                 (float)((uint)bVar11 * auVar192._24_4_ | (uint)!bVar11 * auVar190._24_4_);
            bVar11 = SUB81(uVar136 >> 7,0);
            auVar209._28_4_ =
                 (float)((uint)bVar11 * auVar192._28_4_ | (uint)!bVar11 * auVar190._28_4_);
            auVar318._8_4_ = 0x3f318000;
            auVar318._0_8_ = 0x3f3180003f318000;
            auVar318._12_4_ = 0x3f318000;
            auVar318._16_4_ = 0x3f318000;
            auVar318._20_4_ = 0x3f318000;
            auVar318._24_4_ = 0x3f318000;
            auVar318._28_4_ = 0x3f318000;
            auVar163 = vfmsub231ps_fma(auVar189,auVar209,auVar318);
            auVar192 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar189 = vfnmsub231ps_avx512vl(ZEXT1632(auVar163),auVar209,auVar192);
            auVar258._0_4_ = auVar189._0_4_ * auVar189._0_4_;
            auVar258._4_4_ = auVar189._4_4_ * auVar189._4_4_;
            auVar258._8_4_ = auVar189._8_4_ * auVar189._8_4_;
            auVar258._12_4_ = auVar189._12_4_ * auVar189._12_4_;
            auVar258._16_4_ = auVar189._16_4_ * auVar189._16_4_;
            auVar258._20_4_ = auVar189._20_4_ * auVar189._20_4_;
            auVar258._24_4_ = auVar189._24_4_ * auVar189._24_4_;
            auVar258._28_4_ = 0;
            auVar322._8_4_ = 0x39506967;
            auVar322._0_8_ = 0x3950696739506967;
            auVar322._12_4_ = 0x39506967;
            auVar322._16_4_ = 0x39506967;
            auVar322._20_4_ = 0x39506967;
            auVar322._24_4_ = 0x39506967;
            auVar322._28_4_ = 0x39506967;
            auVar327._8_4_ = 0x3ab743ce;
            auVar327._0_8_ = 0x3ab743ce3ab743ce;
            auVar327._12_4_ = 0x3ab743ce;
            auVar327._16_4_ = 0x3ab743ce;
            auVar327._20_4_ = 0x3ab743ce;
            auVar327._24_4_ = 0x3ab743ce;
            auVar327._28_4_ = 0x3ab743ce;
            auVar163 = vfmadd213ps_fma(auVar322,auVar189,auVar327);
            auVar330._8_4_ = 0x3c088908;
            auVar330._0_8_ = 0x3c0889083c088908;
            auVar330._12_4_ = 0x3c088908;
            auVar330._16_4_ = 0x3c088908;
            auVar330._20_4_ = 0x3c088908;
            auVar330._24_4_ = 0x3c088908;
            auVar330._28_4_ = 0x3c088908;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar189,auVar330);
            auVar334._8_4_ = 0x3d2aa9c1;
            auVar334._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar334._12_4_ = 0x3d2aa9c1;
            auVar334._16_4_ = 0x3d2aa9c1;
            auVar334._20_4_ = 0x3d2aa9c1;
            auVar334._24_4_ = 0x3d2aa9c1;
            auVar334._28_4_ = 0x3d2aa9c1;
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar189,auVar334);
            auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar190 = vfmadd213ps_avx512vl(ZEXT1632(auVar163),auVar189,auVar193);
            auVar163 = vfmadd213ps_fma(auVar190,auVar189,auVar306);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar258,auVar189);
            auVar240._0_4_ = auVar163._0_4_ + 1.0;
            auVar240._4_4_ = auVar163._4_4_ + 1.0;
            auVar240._8_4_ = auVar163._8_4_ + 1.0;
            auVar240._12_4_ = auVar163._12_4_ + 1.0;
            auVar240._16_4_ = 0x3f800000;
            auVar240._20_4_ = 0x3f800000;
            auVar240._24_4_ = 0x3f800000;
            auVar240._28_4_ = 0x3f800000;
            auVar259._0_4_ = (int)auVar209._0_4_;
            auVar259._4_4_ = (int)auVar209._4_4_;
            auVar259._8_4_ = (int)auVar209._8_4_;
            auVar259._12_4_ = (int)auVar209._12_4_;
            auVar259._16_4_ = (int)auVar209._16_4_;
            auVar259._20_4_ = (int)auVar209._20_4_;
            auVar259._24_4_ = (int)auVar209._24_4_;
            auVar259._28_4_ = (int)auVar209._28_4_;
            auVar189 = vpslld_avx2(auVar259,0x17);
            auVar194 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar189 = vpaddd_avx512vl(auVar189,auVar194);
            auVar163 = vfmadd213ps_fma(auVar189,auVar240,auVar314);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar163),_DAT_00593200,2);
            auVar195._8_4_ = 0x800000;
            auVar195._0_8_ = 0x80000000800000;
            auVar195._12_4_ = 0x800000;
            auVar195._16_4_ = 0x800000;
            auVar195._20_4_ = 0x800000;
            auVar195._24_4_ = 0x800000;
            auVar195._28_4_ = 0x800000;
            auVar189 = vmaxps_avx512vl(ZEXT1632(auVar163),auVar195);
            auVar260 = vpsrld_avx2(auVar189,0x17);
            auVar277._8_4_ = 0x807fffff;
            auVar277._0_8_ = 0x807fffff807fffff;
            auVar277._12_4_ = 0x807fffff;
            auVar277._16_4_ = 0x807fffff;
            auVar277._20_4_ = 0x807fffff;
            auVar277._24_4_ = 0x807fffff;
            auVar277._28_4_ = 0x807fffff;
            auVar196._8_4_ = 0x3f000000;
            auVar196._0_8_ = 0x3f0000003f000000;
            auVar196._12_4_ = 0x3f000000;
            auVar196._16_4_ = 0x3f000000;
            auVar196._20_4_ = 0x3f000000;
            auVar196._24_4_ = 0x3f000000;
            auVar196._28_4_ = 0x3f000000;
            auVar189 = vpternlogd_avx512vl(auVar189,auVar277,auVar196,0xea);
            auVar80._8_4_ = 0x3f3504f3;
            auVar80._0_8_ = 0x3f3504f33f3504f3;
            auVar80._12_4_ = 0x3f3504f3;
            auVar80._16_4_ = 0x3f3504f3;
            auVar80._20_4_ = 0x3f3504f3;
            auVar80._24_4_ = 0x3f3504f3;
            auVar80._28_4_ = 0x3f3504f3;
            uVar13 = vcmpps_avx512vl(auVar189,auVar80,1);
            auVar195 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar190 = vaddps_avx512vl(auVar189,auVar195);
            auVar196 = vaddps_avx512vl(auVar190,auVar189);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar210._0_4_ = (float)((uint)bVar11 * auVar196._0_4_ | (uint)!bVar11 * auVar190._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar210._4_4_ = (float)((uint)bVar11 * auVar196._4_4_ | (uint)!bVar11 * auVar190._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar210._8_4_ = (float)((uint)bVar11 * auVar196._8_4_ | (uint)!bVar11 * auVar190._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar210._12_4_ =
                 (float)((uint)bVar11 * auVar196._12_4_ | (uint)!bVar11 * auVar190._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar210._16_4_ =
                 (float)((uint)bVar11 * auVar196._16_4_ | (uint)!bVar11 * auVar190._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar210._20_4_ =
                 (float)((uint)bVar11 * auVar196._20_4_ | (uint)!bVar11 * auVar190._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar210._24_4_ =
                 (float)((uint)bVar11 * auVar196._24_4_ | (uint)!bVar11 * auVar190._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar210._28_4_ = (uint)bVar11 * auVar196._28_4_ | (uint)!bVar11 * auVar190._28_4_;
            auVar115._4_4_ = auVar210._4_4_ * auVar210._4_4_;
            auVar115._0_4_ = auVar210._0_4_ * auVar210._0_4_;
            auVar115._8_4_ = auVar210._8_4_ * auVar210._8_4_;
            auVar115._12_4_ = auVar210._12_4_ * auVar210._12_4_;
            auVar115._16_4_ = auVar210._16_4_ * auVar210._16_4_;
            auVar115._20_4_ = auVar210._20_4_ * auVar210._20_4_;
            auVar115._24_4_ = auVar210._24_4_ * auVar210._24_4_;
            auVar115._28_4_ = auVar189._28_4_;
            auVar283._8_4_ = 0x3d9021bb;
            auVar283._0_8_ = 0x3d9021bb3d9021bb;
            auVar283._12_4_ = 0x3d9021bb;
            auVar283._16_4_ = 0x3d9021bb;
            auVar283._20_4_ = 0x3d9021bb;
            auVar283._24_4_ = 0x3d9021bb;
            auVar283._28_4_ = 0x3d9021bb;
            auVar81._8_4_ = 0xbdebd1b8;
            auVar81._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar81._12_4_ = 0xbdebd1b8;
            auVar81._16_4_ = 0xbdebd1b8;
            auVar81._20_4_ = 0xbdebd1b8;
            auVar81._24_4_ = 0xbdebd1b8;
            auVar81._28_4_ = 0xbdebd1b8;
            auVar189 = vfmadd213ps_avx512vl(auVar283,auVar210,auVar81);
            auVar82._8_4_ = 0x3def251a;
            auVar82._0_8_ = 0x3def251a3def251a;
            auVar82._12_4_ = 0x3def251a;
            auVar82._16_4_ = 0x3def251a;
            auVar82._20_4_ = 0x3def251a;
            auVar82._24_4_ = 0x3def251a;
            auVar82._28_4_ = 0x3def251a;
            auVar189 = vfmadd213ps_avx512vl(auVar189,auVar210,auVar82);
            auVar83._8_4_ = 0xbdfe5d4f;
            auVar83._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar83._12_4_ = 0xbdfe5d4f;
            auVar83._16_4_ = 0xbdfe5d4f;
            auVar83._20_4_ = 0xbdfe5d4f;
            auVar83._24_4_ = 0xbdfe5d4f;
            auVar83._28_4_ = 0xbdfe5d4f;
            auVar189 = vfmadd213ps_avx512vl(auVar189,auVar210,auVar83);
            auVar84._8_4_ = 0x3e11e9bf;
            auVar84._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar84._12_4_ = 0x3e11e9bf;
            auVar84._16_4_ = 0x3e11e9bf;
            auVar84._20_4_ = 0x3e11e9bf;
            auVar84._24_4_ = 0x3e11e9bf;
            auVar84._28_4_ = 0x3e11e9bf;
            auVar189 = vfmadd213ps_avx512vl(auVar189,auVar210,auVar84);
            auVar85._8_4_ = 0xbe2aae50;
            auVar85._0_8_ = 0xbe2aae50be2aae50;
            auVar85._12_4_ = 0xbe2aae50;
            auVar85._16_4_ = 0xbe2aae50;
            auVar85._20_4_ = 0xbe2aae50;
            auVar85._24_4_ = 0xbe2aae50;
            auVar85._28_4_ = 0xbe2aae50;
            auVar189 = vfmadd213ps_avx512vl(auVar189,auVar210,auVar85);
            auVar86._8_4_ = 0x3e4cceac;
            auVar86._0_8_ = 0x3e4cceac3e4cceac;
            auVar86._12_4_ = 0x3e4cceac;
            auVar86._16_4_ = 0x3e4cceac;
            auVar86._20_4_ = 0x3e4cceac;
            auVar86._24_4_ = 0x3e4cceac;
            auVar86._28_4_ = 0x3e4cceac;
            auVar189 = vfmadd213ps_avx512vl(auVar189,auVar210,auVar86);
            auVar87._8_4_ = 0xbe7ffffc;
            auVar87._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar87._12_4_ = 0xbe7ffffc;
            auVar87._16_4_ = 0xbe7ffffc;
            auVar87._20_4_ = 0xbe7ffffc;
            auVar87._24_4_ = 0xbe7ffffc;
            auVar87._28_4_ = 0xbe7ffffc;
            auVar189 = vfmadd213ps_avx512vl(auVar189,auVar210,auVar87);
            auVar88._8_4_ = 0x3eaaaaaa;
            auVar88._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar88._12_4_ = 0x3eaaaaaa;
            auVar88._16_4_ = 0x3eaaaaaa;
            auVar88._20_4_ = 0x3eaaaaaa;
            auVar88._24_4_ = 0x3eaaaaaa;
            auVar88._28_4_ = 0x3eaaaaaa;
            auVar189 = vfmadd213ps_avx512vl(auVar189,auVar210,auVar88);
            auVar116._4_4_ = auVar210._4_4_ * auVar210._4_4_ * auVar210._4_4_ * auVar189._4_4_;
            auVar116._0_4_ = auVar210._0_4_ * auVar210._0_4_ * auVar210._0_4_ * auVar189._0_4_;
            auVar116._8_4_ = auVar210._8_4_ * auVar210._8_4_ * auVar210._8_4_ * auVar189._8_4_;
            auVar116._12_4_ = auVar210._12_4_ * auVar210._12_4_ * auVar210._12_4_ * auVar189._12_4_;
            auVar116._16_4_ = auVar210._16_4_ * auVar210._16_4_ * auVar210._16_4_ * auVar189._16_4_;
            auVar116._20_4_ = auVar210._20_4_ * auVar210._20_4_ * auVar210._20_4_ * auVar189._20_4_;
            auVar116._24_4_ = auVar210._24_4_ * auVar210._24_4_ * auVar210._24_4_ * auVar189._24_4_;
            auVar116._28_4_ = auVar189._28_4_;
            auVar89._8_4_ = 0xffffff82;
            auVar89._0_8_ = 0xffffff82ffffff82;
            auVar89._12_4_ = 0xffffff82;
            auVar89._16_4_ = 0xffffff82;
            auVar89._20_4_ = 0xffffff82;
            auVar89._24_4_ = 0xffffff82;
            auVar89._28_4_ = 0xffffff82;
            auVar189 = vpaddd_avx512vl(auVar260,auVar89);
            auVar189 = vcvtdq2ps_avx(auVar189);
            auVar190 = vsubps_avx512vl(auVar189,auVar314);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar211._0_4_ = (uint)bVar11 * auVar190._0_4_ | (uint)!bVar11 * auVar189._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar211._4_4_ = (uint)bVar11 * auVar190._4_4_ | (uint)!bVar11 * auVar189._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar211._8_4_ = (uint)bVar11 * auVar190._8_4_ | (uint)!bVar11 * auVar189._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar211._12_4_ = (uint)bVar11 * auVar190._12_4_ | (uint)!bVar11 * auVar189._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar211._16_4_ = (uint)bVar11 * auVar190._16_4_ | (uint)!bVar11 * auVar189._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar211._20_4_ = (uint)bVar11 * auVar190._20_4_ | (uint)!bVar11 * auVar189._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar211._24_4_ = (uint)bVar11 * auVar190._24_4_ | (uint)!bVar11 * auVar189._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar211._28_4_ = (uint)bVar11 * auVar190._28_4_ | (uint)!bVar11 * auVar189._28_4_;
            auVar189 = vfmadd231ps_avx512vl(auVar116,auVar211,auVar192);
            auVar163 = vfmsub231ps_fma(auVar189,auVar306,auVar115);
            auVar189 = vsubps_avx(ZEXT1632(auVar163),auVar210);
            auVar163 = vfmsub231ps_fma(auVar189,auVar318,auVar211);
            auVar292._8_4_ = 0xc0000000;
            auVar292._0_8_ = 0xc0000000c0000000;
            auVar292._12_4_ = 0xc0000000;
            auVar292._16_4_ = 0xc0000000;
            auVar292._20_4_ = 0xc0000000;
            auVar292._24_4_ = 0xc0000000;
            auVar292._28_4_ = 0xc0000000;
            auVar189 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar212._0_4_ =
                 (uint)bVar11 * auVar189._0_4_ | (uint)!bVar11 * (int)(auVar163._0_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar212._4_4_ =
                 (uint)bVar11 * auVar189._4_4_ | (uint)!bVar11 * (int)(auVar163._4_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar212._8_4_ =
                 (uint)bVar11 * auVar189._8_4_ | (uint)!bVar11 * (int)(auVar163._8_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar212._12_4_ =
                 (uint)bVar11 * auVar189._12_4_ | (uint)!bVar11 * (int)(auVar163._12_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar212._16_4_ = (uint)bVar11 * auVar189._16_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar212._20_4_ = (uint)bVar11 * auVar189._20_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar212._24_4_ = (uint)bVar11 * auVar189._24_4_ | (uint)!bVar11 * -0x80000000;
            auVar212._28_4_ = (uint)(byte)(uVar136 >> 7) * auVar189._28_4_;
            auVar189 = vminps_avx(auVar212,auVar297);
            auVar189 = vmaxps_avx(auVar189,auVar302);
            auVar163 = vfmadd213ps_fma(auVar310,auVar189,auVar306);
            auVar190 = vroundps_avx(ZEXT1632(auVar163),1);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar163),auVar190,1);
            auVar196 = vsubps_avx512vl(auVar190,auVar314);
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar213._0_4_ = (float)((uint)bVar11 * auVar196._0_4_ | (uint)!bVar11 * auVar190._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar213._4_4_ = (float)((uint)bVar11 * auVar196._4_4_ | (uint)!bVar11 * auVar190._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar213._8_4_ = (float)((uint)bVar11 * auVar196._8_4_ | (uint)!bVar11 * auVar190._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar213._12_4_ =
                 (float)((uint)bVar11 * auVar196._12_4_ | (uint)!bVar11 * auVar190._12_4_);
            bVar11 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar213._16_4_ =
                 (float)((uint)bVar11 * auVar196._16_4_ | (uint)!bVar11 * auVar190._16_4_);
            bVar11 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar213._20_4_ =
                 (float)((uint)bVar11 * auVar196._20_4_ | (uint)!bVar11 * auVar190._20_4_);
            bVar11 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar213._24_4_ =
                 (float)((uint)bVar11 * auVar196._24_4_ | (uint)!bVar11 * auVar190._24_4_);
            bVar11 = SUB81(uVar136 >> 7,0);
            auVar213._28_4_ =
                 (float)((uint)bVar11 * auVar196._28_4_ | (uint)!bVar11 * auVar190._28_4_);
            auVar163 = vfmsub231ps_fma(auVar189,auVar213,auVar318);
            auVar189 = vfnmsub231ps_avx512vl(ZEXT1632(auVar163),auVar213,auVar192);
            auVar261._0_4_ = auVar189._0_4_ * auVar189._0_4_;
            auVar261._4_4_ = auVar189._4_4_ * auVar189._4_4_;
            auVar261._8_4_ = auVar189._8_4_ * auVar189._8_4_;
            auVar261._12_4_ = auVar189._12_4_ * auVar189._12_4_;
            auVar261._16_4_ = auVar189._16_4_ * auVar189._16_4_;
            auVar261._20_4_ = auVar189._20_4_ * auVar189._20_4_;
            auVar261._24_4_ = auVar189._24_4_ * auVar189._24_4_;
            auVar261._28_4_ = 0;
            auVar163 = vfmadd213ps_fma(auVar322,auVar189,auVar327);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar189,auVar330);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar189,auVar334);
            auVar190 = vfmadd213ps_avx512vl(ZEXT1632(auVar163),auVar189,auVar193);
            auVar163 = vfmadd213ps_fma(auVar190,auVar189,auVar306);
            auVar163 = vfmadd213ps_fma(ZEXT1632(auVar163),auVar261,auVar189);
            auVar241._0_4_ = auVar163._0_4_ + 1.0;
            auVar241._4_4_ = auVar163._4_4_ + 1.0;
            auVar241._8_4_ = auVar163._8_4_ + 1.0;
            auVar241._12_4_ = auVar163._12_4_ + 1.0;
            auVar241._16_4_ = 0x3f800000;
            auVar241._20_4_ = 0x3f800000;
            auVar241._24_4_ = 0x3f800000;
            auVar241._28_4_ = 0x3f800000;
            auVar262._0_4_ = (int)auVar213._0_4_;
            auVar262._4_4_ = (int)auVar213._4_4_;
            auVar262._8_4_ = (int)auVar213._8_4_;
            auVar262._12_4_ = (int)auVar213._12_4_;
            auVar262._16_4_ = (int)auVar213._16_4_;
            auVar262._20_4_ = (int)auVar213._20_4_;
            auVar262._24_4_ = (int)auVar213._24_4_;
            auVar262._28_4_ = (int)auVar213._28_4_;
            auVar189 = vpslld_avx2(auVar262,0x17);
            auVar189 = vpaddd_avx512vl(auVar189,auVar194);
            auVar163 = vfmadd213ps_fma(auVar189,auVar241,auVar314);
            auVar189 = vrcpps_avx(ZEXT1632(auVar163));
            auVar163 = vfmsub213ps_fma(ZEXT1632(auVar163),auVar189,auVar314);
            auVar163 = vfnmadd132ps_fma(ZEXT1632(auVar163),auVar189,auVar189);
            auVar189 = vfnmadd213ps_avx512vl(ZEXT1632(auVar163),auVar292,auVar195);
            auVar191._4_4_ = auVar189._4_4_ * auVar191._4_4_;
            auVar191._0_4_ = auVar189._0_4_ * auVar191._0_4_;
            auVar191._8_4_ = auVar189._8_4_ * auVar191._8_4_;
            auVar191._12_4_ = auVar189._12_4_ * auVar191._12_4_;
            auVar191._16_4_ = auVar189._16_4_ * auVar191._16_4_;
            auVar191._20_4_ = auVar189._20_4_ * auVar191._20_4_;
            auVar191._24_4_ = auVar189._24_4_ * auVar191._24_4_;
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar194._4_4_ = uVar1;
            auVar194._0_4_ = uVar1;
            auVar194._8_4_ = uVar1;
            auVar194._12_4_ = uVar1;
            auVar194._16_4_ = uVar1;
            auVar194._20_4_ = uVar1;
            auVar194._24_4_ = uVar1;
            auVar194._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar192._4_4_ = uVar1;
            auVar192._0_4_ = uVar1;
            auVar192._8_4_ = uVar1;
            auVar192._12_4_ = uVar1;
            auVar192._16_4_ = uVar1;
            auVar192._20_4_ = uVar1;
            auVar192._24_4_ = uVar1;
            auVar192._28_4_ = uVar1;
            auVar189 = vfmadd213ps_avx512vl(auVar194,auVar191,auVar192);
            auVar189 = vmaxps_avx(auVar189,_DAT_00593200);
            auVar193._8_4_ = 0x3f800000;
            auVar193._0_8_ = 0x3f8000003f800000;
            auVar193._12_4_ = 0x3f800000;
            auVar193._16_4_ = 0x3f800000;
            auVar193._20_4_ = 0x3f800000;
            auVar193._24_4_ = 0x3f800000;
            auVar193._28_4_ = 0x3f800000;
            auVar189 = vminps_avx512vl(auVar189,auVar193);
            auVar191._4_4_ = auVar189._4_4_ * auVar191._4_4_;
            auVar191._0_4_ = auVar189._0_4_ * auVar191._0_4_;
            auVar191._8_4_ = auVar189._8_4_ * auVar191._8_4_;
            auVar191._12_4_ = auVar189._12_4_ * auVar191._12_4_;
            auVar191._16_4_ = auVar189._16_4_ * auVar191._16_4_;
            auVar191._20_4_ = auVar189._20_4_ * auVar191._20_4_;
            auVar191._24_4_ = auVar189._24_4_ * auVar191._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar156 * 0x20) = auVar191;
          uVar156 = local_2f8 + 1;
          lVar146 = local_2c0 + 8;
          lVar141 = local_2c8 + 8;
          lVar143 = local_2d0 + 8;
          lVar144 = local_2d8 + 8;
          lVar147 = local_2e0 + 8;
          lVar137 = local_2e8 + 8;
          lVar159 = local_2f0 + 8;
          local_300 = local_300 + 8;
        } while (uVar156 != local_220);
      }
      auVar163 = local_278;
      local_238 = (ulong)(int)uVar134;
      uVar156 = local_238 & 0xfffffffffffffff8;
      fVar263 = (float)(uVar134 >> 2 & 1);
      if ((uVar134 >> 2 & 1) != 0) {
        uStack_284 = 0;
        if (lVar8 == 0) {
          auVar164 = ZEXT816(0) << 0x40;
        }
        else {
          auVar164 = *(undefined1 (*) [16])(lVar8 + uVar156 * 4);
        }
        pvVar9 = (this->weight_data_tm).data;
        lVar146 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pauVar161 = (undefined1 (*) [16])(lVar146 * uVar156 + (long)pvVar9);
        pauVar158 = (undefined1 (*) [16])((uVar156 | 1) * lVar146 + (long)pvVar9);
        pauVar160 = (undefined1 (*) [16])((uVar156 | 2) * lVar146 + (long)pvVar9);
        pauVar140 = (undefined1 (*) [16])((uVar156 | 3) * lVar146 + (long)pvVar9);
        pauVar142 = local_3b8;
        if ((int)uVar157 < 8) {
          uVar150 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar150 = uVar157 & 0xfffffff8;
          auVar215 = ZEXT864(0);
          iVar145 = 7;
          auVar217 = ZEXT864(0);
          auVar218 = ZEXT864(0);
          auVar216 = ZEXT864(0);
          do {
            auVar189 = *pauVar142;
            auVar165 = vlddqu_avx(*pauVar161);
            auVar190 = vcvtph2ps_f16c(auVar165);
            auVar165 = vlddqu_avx(*pauVar158);
            auVar191 = vcvtph2ps_f16c(auVar165);
            auVar165 = vlddqu_avx(*pauVar160);
            auVar192 = vcvtph2ps_f16c(auVar165);
            auVar165 = vlddqu_avx(*pauVar140);
            auVar193 = vcvtph2ps_f16c(auVar165);
            auVar165 = vfmadd231ps_fma(auVar216._0_32_,auVar189,auVar190);
            auVar216 = ZEXT1664(auVar165);
            local_1b8 = ZEXT1632(auVar165);
            auVar165 = vfmadd231ps_fma(auVar218._0_32_,auVar189,auVar191);
            auVar218 = ZEXT1664(auVar165);
            local_1f8 = ZEXT1632(auVar165);
            auVar165 = vfmadd231ps_fma(auVar217._0_32_,auVar189,auVar192);
            auVar217 = ZEXT1664(auVar165);
            local_1d8 = ZEXT1632(auVar165);
            auVar165 = vfmadd231ps_fma(auVar215._0_32_,auVar189,auVar193);
            auVar215 = ZEXT1664(auVar165);
            local_198 = ZEXT1632(auVar165);
            pauVar142 = pauVar142 + 1;
            pauVar161 = pauVar161 + 1;
            pauVar158 = pauVar158 + 1;
            pauVar160 = pauVar160 + 1;
            pauVar140 = pauVar140 + 1;
            iVar145 = iVar145 + 8;
          } while (iVar145 < (int)uVar157);
        }
        local_348 = ZEXT816(0) << 0x40;
        if ((int)(uVar150 | 3) < (int)uVar157) {
          auVar215 = ZEXT864(0);
          lVar146 = 0;
          auVar216 = ZEXT864(0);
          local_368 = ZEXT816(0);
          pauVar138 = pauVar142;
          uVar151 = uVar150;
          do {
            auVar165._8_8_ = 0;
            auVar165._0_8_ = *(ulong *)(*pauVar161 + lVar146);
            auVar169 = vcvtph2ps_f16c(auVar165);
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(*pauVar158 + lVar146);
            auVar166 = vcvtph2ps_f16c(auVar166);
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(*pauVar160 + lVar146);
            auVar167 = vcvtph2ps_f16c(auVar167);
            auVar165 = *(undefined1 (*) [16])(*pauVar142 + lVar146 * 2);
            auVar168._8_8_ = 0;
            auVar168._0_8_ = *(ulong *)(*pauVar140 + lVar146);
            auVar168 = vcvtph2ps_f16c(auVar168);
            local_348 = vfmadd231ps_fma(local_348,auVar165,auVar169);
            local_368 = vfmadd231ps_fma(local_368,auVar165,auVar166);
            local_358 = vfmadd231ps_fma(auVar216._0_16_,auVar165,auVar167);
            auVar216 = ZEXT1664(local_358);
            local_298 = vfmadd231ps_fma(auVar215._0_16_,auVar165,auVar168);
            auVar215 = ZEXT1664(local_298);
            pauVar138 = (undefined1 (*) [32])(*pauVar138 + 0x10);
            uVar150 = uVar151 + 4;
            iVar145 = uVar151 + 7;
            lVar146 = lVar146 + 8;
            uVar151 = uVar150;
          } while (iVar145 < (int)uVar157);
          pauVar140 = (undefined1 (*) [16])(*pauVar140 + lVar146);
          pauVar160 = (undefined1 (*) [16])(*pauVar160 + lVar146);
          pauVar158 = (undefined1 (*) [16])(*pauVar158 + lVar146);
          pauVar161 = (undefined1 (*) [16])(*pauVar161 + lVar146);
          pauVar142 = pauVar138;
        }
        else {
          local_368 = ZEXT816(0);
          local_358 = SUB6416(ZEXT864(0),0);
          local_298 = SUB6416(ZEXT864(0),0);
        }
        local_278._4_4_ = 0;
        local_278._0_4_ = uVar157 - uVar150;
        local_278._8_8_ = auVar163._8_8_;
        local_288 = fVar263;
        if (uVar157 - uVar150 != 0 && (int)uVar150 <= (int)uVar157) {
          lVar146 = 0;
          do {
            local_2b8._0_16_ = auVar164;
            local_318 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
            fVar263 = float16_to_float32(*(unsigned_short *)(*pauVar161 + lVar146 * 2));
            auVar189 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_06;
            local_218._0_4_ = fVar263;
            fStack_210 = (float)extraout_XMM0_Dc_05;
            _fStack_208 = auVar189._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_05;
            _local_328 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
            local_338._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar158 + lVar146 * 2));
            local_338._4_4_ = extraout_XMM0_Db_07;
            local_338._8_4_ = extraout_XMM0_Dc_06;
            local_338._12_4_ = extraout_XMM0_Dd_06;
            local_248 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
            local_258._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar160 + lVar146 * 2));
            local_258._4_4_ = extraout_XMM0_Db_08;
            local_258._8_4_ = extraout_XMM0_Dc_07;
            local_258._12_4_ = extraout_XMM0_Dd_07;
            local_268 = ZEXT416(*(uint *)(*pauVar142 + lVar146 * 4));
            auVar216._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar140 + lVar146 * 2));
            auVar216._4_60_ = extraout_var_00;
            auVar163 = vinsertps_avx(_local_218,ZEXT416((uint)local_338._0_4_),0x10);
            auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_258._0_4_),0x20);
            auVar163 = vinsertps_avx(auVar163,auVar216._0_16_,0x30);
            auVar164 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
            auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_248._0_4_),0x20);
            auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_268._0_4_),0x30);
            auVar164 = vfmadd231ps_fma(local_2b8._0_16_,auVar163,auVar164);
            lVar146 = lVar146 + 1;
          } while (local_278._0_4_ != (int)lVar146);
        }
        auVar189 = vhaddps_avx(local_1b8,local_1f8);
        auVar190 = vhaddps_avx(local_1d8,local_198);
        auVar189 = vhaddps_avx(auVar189,auVar190);
        auVar165 = vunpcklps_avx(local_348,local_368);
        auVar166 = vunpcklps_avx(local_358,local_298);
        auVar167 = vunpckhps_avx(local_348,local_368);
        auVar168 = vunpckhps_avx(local_358,local_298);
        auVar163 = vmovlhps_avx(auVar165,auVar166);
        auVar166 = vunpckhpd_avx(auVar165,auVar166);
        auVar165 = vmovlhps_avx(auVar167,auVar168);
        auVar167 = vunpckhpd_avx(auVar167,auVar168);
        auVar169._0_4_ =
             auVar166._0_4_ + auVar163._0_4_ + auVar165._0_4_ + auVar167._0_4_ +
             auVar164._0_4_ + auVar189._0_4_ + auVar189._16_4_;
        auVar169._4_4_ =
             auVar166._4_4_ + auVar163._4_4_ + auVar165._4_4_ + auVar167._4_4_ +
             auVar164._4_4_ + auVar189._4_4_ + auVar189._20_4_;
        auVar169._8_4_ =
             auVar166._8_4_ + auVar163._8_4_ + auVar165._8_4_ + auVar167._8_4_ +
             auVar164._8_4_ + auVar189._8_4_ + auVar189._24_4_;
        auVar169._12_4_ =
             auVar166._12_4_ + auVar163._12_4_ + auVar165._12_4_ + auVar167._12_4_ +
             auVar164._12_4_ + auVar189._12_4_ + auVar189._28_4_;
        switch(iVar5) {
        case 1:
          auVar169 = vmaxps_avx(auVar169,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar163 = vmaxps_avx(auVar169,ZEXT816(0) << 0x20);
          auVar164 = vminps_avx(auVar169,ZEXT816(0) << 0x20);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar169 = vfmadd132ps_avx512vl(auVar164,auVar163,auVar54);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar52._4_4_ = uVar1;
          auVar52._0_4_ = uVar1;
          auVar52._8_4_ = uVar1;
          auVar52._12_4_ = uVar1;
          auVar163 = vmaxps_avx512vl(auVar169,auVar52);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar53._4_4_ = uVar1;
          auVar53._0_4_ = uVar1;
          auVar53._8_4_ = uVar1;
          auVar53._12_4_ = uVar1;
          auVar169 = vminps_avx512vl(auVar163,auVar53);
          break;
        case 4:
          auVar42._8_4_ = 0x80000000;
          auVar42._0_8_ = 0x8000000080000000;
          auVar42._12_4_ = 0x80000000;
          auVar163 = vxorps_avx512vl(auVar169,auVar42);
          auVar43._8_4_ = 0x42b0c0a5;
          auVar43._0_8_ = 0x42b0c0a542b0c0a5;
          auVar43._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx512vl(auVar163,auVar43);
          auVar44._8_4_ = 0xc2b0c0a5;
          auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar44._12_4_ = 0xc2b0c0a5;
          auVar165 = vmaxps_avx512vl(auVar163,auVar44);
          auVar237._8_4_ = 0x3f000000;
          auVar237._0_8_ = 0x3f0000003f000000;
          auVar237._12_4_ = 0x3f000000;
          auVar252._8_4_ = 0x3fb8aa3b;
          auVar252._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar252._12_4_ = 0x3fb8aa3b;
          auVar164 = vfmadd213ps_fma(auVar252,auVar165,auVar237);
          auVar274._0_4_ = (int)auVar164._0_4_;
          auVar274._4_4_ = (int)auVar164._4_4_;
          auVar274._8_4_ = (int)auVar164._8_4_;
          auVar274._12_4_ = (int)auVar164._12_4_;
          auVar163 = vcvtdq2ps_avx(auVar274);
          auVar282._8_4_ = 0x3f800000;
          auVar282._0_8_ = 0x3f8000003f800000;
          auVar282._12_4_ = 0x3f800000;
          uVar136 = vcmpps_avx512vl(auVar164,auVar163,1);
          auVar164 = vsubps_avx512vl(auVar163,auVar282);
          bVar11 = (bool)((byte)uVar136 & 1);
          auVar188._0_4_ = (float)((uint)bVar11 * auVar164._0_4_ | (uint)!bVar11 * auVar163._0_4_);
          bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
          auVar188._4_4_ = (float)((uint)bVar11 * auVar164._4_4_ | (uint)!bVar11 * auVar163._4_4_);
          bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
          auVar188._8_4_ = (float)((uint)bVar11 * auVar164._8_4_ | (uint)!bVar11 * auVar163._8_4_);
          bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
          auVar188._12_4_ =
               (float)((uint)bVar11 * auVar164._12_4_ | (uint)!bVar11 * auVar163._12_4_);
          auVar45._8_4_ = 0x3f318000;
          auVar45._0_8_ = 0x3f3180003f318000;
          auVar45._12_4_ = 0x3f318000;
          auVar163 = vfmsub231ps_avx512vl(auVar165,auVar188,auVar45);
          auVar46._8_4_ = 0x395e8083;
          auVar46._0_8_ = 0x395e8083395e8083;
          auVar46._12_4_ = 0x395e8083;
          auVar164 = vfmsub231ps_avx512vl(auVar163,auVar188,auVar46);
          auVar253._8_4_ = 0x39506967;
          auVar253._0_8_ = 0x3950696739506967;
          auVar253._12_4_ = 0x39506967;
          auVar47._8_4_ = 0x3ab743ce;
          auVar47._0_8_ = 0x3ab743ce3ab743ce;
          auVar47._12_4_ = 0x3ab743ce;
          auVar163 = vfmadd213ps_avx512vl(auVar253,auVar164,auVar47);
          auVar48._8_4_ = 0x3c088908;
          auVar48._0_8_ = 0x3c0889083c088908;
          auVar48._12_4_ = 0x3c088908;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar164,auVar48);
          auVar49._8_4_ = 0x3d2aa9c1;
          auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar49._12_4_ = 0x3d2aa9c1;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar164,auVar49);
          auVar50._8_4_ = 0x3e2aaaaa;
          auVar50._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar50._12_4_ = 0x3e2aaaaa;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar164,auVar50);
          auVar290._0_4_ = auVar164._0_4_ * auVar164._0_4_;
          auVar290._4_4_ = auVar164._4_4_ * auVar164._4_4_;
          auVar290._8_4_ = auVar164._8_4_ * auVar164._8_4_;
          auVar290._12_4_ = auVar164._12_4_ * auVar164._12_4_;
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar237);
          auVar163 = vfmadd213ps_fma(auVar163,auVar290,auVar164);
          auVar238._0_4_ = auVar163._0_4_ + 1.0;
          auVar238._4_4_ = auVar163._4_4_ + 1.0;
          auVar238._8_4_ = auVar163._8_4_ + 1.0;
          auVar238._12_4_ = auVar163._12_4_ + 1.0;
          auVar232._0_4_ = (int)auVar188._0_4_;
          auVar232._4_4_ = (int)auVar188._4_4_;
          auVar232._8_4_ = (int)auVar188._8_4_;
          auVar232._12_4_ = (int)auVar188._12_4_;
          auVar163 = vpslld_avx(auVar232,0x17);
          auVar51._8_4_ = 0x3f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar51._12_4_ = 0x3f800000;
          auVar163 = vpaddd_avx512vl(auVar163,auVar51);
          auVar164 = vfmadd213ps_fma(auVar163,auVar238,auVar282);
          auVar163 = vrcpps_avx(auVar164);
          auVar164 = vfmsub213ps_fma(auVar164,auVar163,auVar282);
          auVar169 = vfnmadd132ps_fma(auVar164,auVar163,auVar163);
          break;
        case 5:
          auVar295._8_4_ = 0x42b0c0a5;
          auVar295._0_8_ = 0x42b0c0a542b0c0a5;
          auVar295._12_4_ = 0x42b0c0a5;
          auVar163 = vminps_avx(auVar169,auVar295);
          auVar299._8_4_ = 0xc2b0c0a5;
          auVar299._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar299._12_4_ = 0xc2b0c0a5;
          auVar280._8_4_ = 0x3fb8aa3b;
          auVar280._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar280._12_4_ = 0x3fb8aa3b;
          auVar164 = vmaxps_avx(auVar163,auVar299);
          auVar249._8_4_ = 0x3f000000;
          auVar249._0_8_ = 0x3f0000003f000000;
          auVar249._12_4_ = 0x3f000000;
          auVar165 = vfmadd213ps_fma(auVar280,auVar164,auVar249);
          auVar271._0_4_ = (int)auVar165._0_4_;
          auVar271._4_4_ = (int)auVar165._4_4_;
          auVar271._8_4_ = (int)auVar165._8_4_;
          auVar271._12_4_ = (int)auVar165._12_4_;
          auVar163 = vcvtdq2ps_avx(auVar271);
          uVar136 = vcmpps_avx512vl(auVar165,auVar163,1);
          auVar236._8_4_ = 0x3f800000;
          auVar236._0_8_ = 0x3f8000003f800000;
          auVar236._12_4_ = 0x3f800000;
          auVar272._8_4_ = 0x3f318000;
          auVar272._0_8_ = 0x3f3180003f318000;
          auVar272._12_4_ = 0x3f318000;
          auVar165 = vsubps_avx512vl(auVar163,auVar236);
          bVar11 = (bool)((byte)uVar136 & 1);
          auVar183._0_4_ = (float)((uint)bVar11 * auVar165._0_4_ | (uint)!bVar11 * auVar163._0_4_);
          bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
          auVar183._4_4_ = (float)((uint)bVar11 * auVar165._4_4_ | (uint)!bVar11 * auVar163._4_4_);
          bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
          auVar183._8_4_ = (float)((uint)bVar11 * auVar165._8_4_ | (uint)!bVar11 * auVar163._8_4_);
          bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
          auVar183._12_4_ =
               (float)((uint)bVar11 * auVar165._12_4_ | (uint)!bVar11 * auVar163._12_4_);
          auVar163 = vfmsub231ps_fma(auVar164,auVar183,auVar272);
          auVar304._8_4_ = 0xb95e8083;
          auVar304._0_8_ = 0xb95e8083b95e8083;
          auVar304._12_4_ = 0xb95e8083;
          auVar163 = vfnmsub231ps_fma(auVar163,auVar183,auVar304);
          auVar332._0_4_ = auVar163._0_4_ * auVar163._0_4_;
          auVar332._4_4_ = auVar163._4_4_ * auVar163._4_4_;
          auVar332._8_4_ = auVar163._8_4_ * auVar163._8_4_;
          auVar332._12_4_ = auVar163._12_4_ * auVar163._12_4_;
          auVar308._8_4_ = 0x3ab743ce;
          auVar308._0_8_ = 0x3ab743ce3ab743ce;
          auVar308._12_4_ = 0x3ab743ce;
          auVar289._8_4_ = 0x39506967;
          auVar289._0_8_ = 0x3950696739506967;
          auVar289._12_4_ = 0x39506967;
          auVar164 = vfmadd213ps_avx512vl(auVar289,auVar163,auVar308);
          auVar312._8_4_ = 0x3c088908;
          auVar312._0_8_ = 0x3c0889083c088908;
          auVar312._12_4_ = 0x3c088908;
          auVar316._8_4_ = 0x3d2aa9c1;
          auVar316._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar316._12_4_ = 0x3d2aa9c1;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar312);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar316);
          auVar320._8_4_ = 0x3e2aaaaa;
          auVar320._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar320._12_4_ = 0x3e2aaaaa;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar320);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar163,auVar249);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar332,auVar163);
          auVar165 = vaddps_avx512vl(auVar164,auVar236);
          auVar324._0_4_ = (int)auVar183._0_4_;
          auVar324._4_4_ = (int)auVar183._4_4_;
          auVar324._8_4_ = (int)auVar183._8_4_;
          auVar324._12_4_ = (int)auVar183._12_4_;
          auVar163 = vpslld_avx(auVar324,0x17);
          auVar325._8_4_ = 0x3f800000;
          auVar325._0_8_ = 0x3f8000003f800000;
          auVar325._12_4_ = 0x3f800000;
          auVar163 = vpaddd_avx(auVar163,auVar325);
          auVar163 = vfmadd213ps_fma(auVar163,auVar165,auVar236);
          auVar172._8_4_ = 0x800000;
          auVar172._0_8_ = 0x80000000800000;
          auVar172._12_4_ = 0x800000;
          auVar165 = vmaxps_avx512vl(auVar163,auVar172);
          auVar164 = vxorps_avx512vl(auVar164,auVar164);
          auVar166 = vpsrld_avx512vl(auVar165,0x17);
          auVar167 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
          auVar171._8_4_ = 0x807fffff;
          auVar171._0_8_ = 0x807fffff807fffff;
          auVar171._12_4_ = 0x807fffff;
          auVar165 = vpternlogd_avx512vl(auVar167,auVar165,auVar171,0xf8);
          auVar173._8_4_ = 0xffffff82;
          auVar173._0_8_ = 0xffffff82ffffff82;
          auVar173._12_4_ = 0xffffff82;
          auVar166 = vpaddd_avx512vl(auVar166,auVar173);
          uVar136 = vcmpps_avx512vl(auVar163,auVar164,2);
          auVar163 = vcvtdq2ps_avx(auVar166);
          auVar174._8_4_ = 0x3f3504f3;
          auVar174._0_8_ = 0x3f3504f33f3504f3;
          auVar174._12_4_ = 0x3f3504f3;
          uVar13 = vcmpps_avx512vl(auVar165,auVar174,1);
          auVar32._8_4_ = 0xbf800000;
          auVar32._0_8_ = 0xbf800000bf800000;
          auVar32._12_4_ = 0xbf800000;
          auVar164 = vaddps_avx512vl(auVar165,auVar32);
          auVar166 = vsubps_avx512vl(auVar163,auVar236);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar184._0_4_ = (uint)bVar11 * auVar166._0_4_ | (uint)!bVar11 * auVar163._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar184._4_4_ = (uint)bVar11 * auVar166._4_4_ | (uint)!bVar11 * auVar163._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar184._8_4_ = (uint)bVar11 * auVar166._8_4_ | (uint)!bVar11 * auVar163._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar184._12_4_ = (uint)bVar11 * auVar166._12_4_ | (uint)!bVar11 * auVar163._12_4_;
          auVar163 = vaddps_avx512vl(auVar164,auVar165);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar185._0_4_ = (uint)bVar11 * auVar163._0_4_ | (uint)!bVar11 * auVar164._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar185._4_4_ = (uint)bVar11 * auVar163._4_4_ | (uint)!bVar11 * auVar164._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar185._8_4_ = (uint)bVar11 * auVar163._8_4_ | (uint)!bVar11 * auVar164._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar185._12_4_ = (uint)bVar11 * auVar163._12_4_ | (uint)!bVar11 * auVar164._12_4_;
          auVar163 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar33._8_4_ = 0xbdebd1b8;
          auVar33._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar33._12_4_ = 0xbdebd1b8;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar33);
          auVar34._8_4_ = 0x3def251a;
          auVar34._0_8_ = 0x3def251a3def251a;
          auVar34._12_4_ = 0x3def251a;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar34);
          auVar35._8_4_ = 0xbdfe5d4f;
          auVar35._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar35._12_4_ = 0xbdfe5d4f;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar35);
          auVar36._8_4_ = 0x3e11e9bf;
          auVar36._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar36._12_4_ = 0x3e11e9bf;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar36);
          auVar37._8_4_ = 0xbe2aae50;
          auVar37._0_8_ = 0xbe2aae50be2aae50;
          auVar37._12_4_ = 0xbe2aae50;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar37);
          auVar38._8_4_ = 0x3e4cceac;
          auVar38._0_8_ = 0x3e4cceac3e4cceac;
          auVar38._12_4_ = 0x3e4cceac;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar38);
          auVar39._8_4_ = 0xbe7ffffc;
          auVar39._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar39._12_4_ = 0xbe7ffffc;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar39);
          auVar164 = vmulps_avx512vl(auVar185,auVar185);
          auVar40._8_4_ = 0x3eaaaaaa;
          auVar40._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar40._12_4_ = 0x3eaaaaaa;
          auVar163 = vfmadd213ps_avx512vl(auVar163,auVar185,auVar40);
          auVar165 = vmulps_avx512vl(auVar164,auVar185);
          auVar163 = vmulps_avx512vl(auVar165,auVar163);
          auVar163 = vfmadd231ps_avx512vl(auVar163,auVar184,auVar304);
          auVar163 = vfmsub231ps_avx512vl(auVar163,auVar249,auVar164);
          auVar163 = vsubps_avx512vl(auVar163,auVar185);
          auVar163 = vfnmadd231ps_fma(auVar163,auVar272,auVar184);
          auVar164 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar136 & 1);
          auVar186._0_4_ =
               (uint)bVar11 * auVar164._0_4_ |
               (uint)!bVar11 * (int)(auVar163._0_4_ + auVar163._0_4_);
          bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
          auVar186._4_4_ =
               (uint)bVar11 * auVar164._4_4_ |
               (uint)!bVar11 * (int)(auVar163._4_4_ + auVar163._4_4_);
          bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
          auVar186._8_4_ =
               (uint)bVar11 * auVar164._8_4_ |
               (uint)!bVar11 * (int)(auVar163._8_4_ + auVar163._8_4_);
          bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
          auVar186._12_4_ =
               (uint)bVar11 * auVar164._12_4_ |
               (uint)!bVar11 * (int)(auVar163._12_4_ + auVar163._12_4_);
          auVar163 = vminps_avx(auVar186,auVar295);
          auVar164 = vmaxps_avx(auVar163,auVar299);
          auVar165 = vfmadd213ps_fma(auVar280,auVar164,auVar249);
          auVar300._0_4_ = (int)auVar165._0_4_;
          auVar300._4_4_ = (int)auVar165._4_4_;
          auVar300._8_4_ = (int)auVar165._8_4_;
          auVar300._12_4_ = (int)auVar165._12_4_;
          auVar163 = vcvtdq2ps_avx(auVar300);
          uVar136 = vcmpps_avx512vl(auVar165,auVar163,1);
          auVar165 = vsubps_avx512vl(auVar163,auVar236);
          bVar11 = (bool)((byte)uVar136 & 1);
          auVar187._0_4_ = (float)((uint)bVar11 * auVar165._0_4_ | (uint)!bVar11 * auVar163._0_4_);
          bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
          auVar187._4_4_ = (float)((uint)bVar11 * auVar165._4_4_ | (uint)!bVar11 * auVar163._4_4_);
          bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
          auVar187._8_4_ = (float)((uint)bVar11 * auVar165._8_4_ | (uint)!bVar11 * auVar163._8_4_);
          bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
          auVar187._12_4_ =
               (float)((uint)bVar11 * auVar165._12_4_ | (uint)!bVar11 * auVar163._12_4_);
          auVar163 = vfmsub213ps_fma(auVar272,auVar187,auVar164);
          auVar164 = vfnmsub231ps_fma(auVar163,auVar187,auVar304);
          auVar281._0_4_ = auVar164._0_4_ * auVar164._0_4_;
          auVar281._4_4_ = auVar164._4_4_ * auVar164._4_4_;
          auVar281._8_4_ = auVar164._8_4_ * auVar164._8_4_;
          auVar281._12_4_ = auVar164._12_4_ * auVar164._12_4_;
          auVar163 = vfmadd213ps_fma(auVar289,auVar164,auVar308);
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar312);
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar316);
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar320);
          auVar163 = vfmadd213ps_fma(auVar163,auVar164,auVar249);
          auVar163 = vfmadd213ps_fma(auVar163,auVar281,auVar164);
          auVar250._0_4_ = auVar163._0_4_ + 1.0;
          auVar250._4_4_ = auVar163._4_4_ + 1.0;
          auVar250._8_4_ = auVar163._8_4_ + 1.0;
          auVar250._12_4_ = auVar163._12_4_ + 1.0;
          auVar273._0_4_ = (int)auVar187._0_4_;
          auVar273._4_4_ = (int)auVar187._4_4_;
          auVar273._8_4_ = (int)auVar187._8_4_;
          auVar273._12_4_ = (int)auVar187._12_4_;
          auVar163 = vpslld_avx(auVar273,0x17);
          auVar163 = vpaddd_avx(auVar325,auVar163);
          auVar164 = vfmadd213ps_fma(auVar163,auVar250,auVar236);
          auVar163 = vrcpps_avx(auVar164);
          auVar251._0_4_ = auVar163._0_4_ + auVar163._0_4_;
          auVar251._4_4_ = auVar163._4_4_ + auVar163._4_4_;
          auVar251._8_4_ = auVar163._8_4_ + auVar163._8_4_;
          auVar251._12_4_ = auVar163._12_4_ + auVar163._12_4_;
          auVar41._8_4_ = 0x40000000;
          auVar41._0_8_ = 0x4000000040000000;
          auVar41._12_4_ = 0x40000000;
          auVar164 = vfmsub213ps_avx512vl(auVar164,auVar251,auVar41);
          auVar163 = vfnmadd213ps_fma(auVar164,auVar163,auVar251);
          auVar169 = vfmsub231ps_fma(auVar169,auVar169,auVar163);
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar175._4_4_ = uVar1;
          auVar175._0_4_ = uVar1;
          auVar175._8_4_ = uVar1;
          auVar175._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar164._4_4_ = uVar1;
          auVar164._0_4_ = uVar1;
          auVar164._8_4_ = uVar1;
          auVar164._12_4_ = uVar1;
          auVar163 = vfmadd213ps_avx512vl(auVar175,auVar169,auVar164);
          auVar231._12_4_ = 0;
          auVar231._0_12_ = ZEXT412(0);
          auVar163 = vmaxps_avx(auVar163,auVar231 << 0x20);
          auVar170._8_4_ = 0x3f800000;
          auVar170._0_8_ = 0x3f8000003f800000;
          auVar170._12_4_ = 0x3f800000;
          auVar163 = vminps_avx512vl(auVar163,auVar170);
          auVar169._0_4_ = auVar163._0_4_ * auVar169._0_4_;
          auVar169._4_4_ = auVar163._4_4_ * auVar169._4_4_;
          auVar169._8_4_ = auVar163._8_4_ * auVar169._8_4_;
          auVar169._12_4_ = auVar163._12_4_ * auVar169._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar156 * 4) = auVar169;
        fVar263 = local_288;
      }
      iVar133 = (int)uVar156 + (int)fVar263 * 4;
      iVar145 = 0;
      if ((int)uVar134 <= iVar133) goto LAB_002bb756;
      local_338._0_4_ = uVar157 & 0xfffffff8;
      uVar156 = (ulong)iVar133;
      do {
        auVar215 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar8 != 0) {
          auVar215 = ZEXT464(*(uint *)(lVar8 + uVar156 * 4));
        }
        fVar263 = auVar215._0_4_;
        pauVar140 = (undefined1 (*) [16])
                    ((long)(this->weight_data_tm).w * uVar156 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        pauVar142 = local_3b8;
        if ((int)uVar157 < 8) {
          uVar134 = 0;
          _local_218 = SUB6432(ZEXT864(0),0);
        }
        else {
          auVar216 = ZEXT864(0);
          iVar145 = 7;
          do {
            auVar163 = vlddqu_avx(*pauVar140);
            auVar189 = vcvtph2ps_f16c(auVar163);
            auVar163 = vfmadd231ps_fma(auVar216._0_32_,auVar189,*pauVar142);
            auVar216 = ZEXT1664(auVar163);
            _local_218 = ZEXT1632(auVar163);
            pauVar142 = pauVar142 + 1;
            pauVar140 = pauVar140 + 1;
            iVar145 = iVar145 + 8;
          } while (iVar145 < (int)uVar157);
          uVar134 = local_338._0_4_;
        }
        _local_328 = ZEXT816(0) << 0x40;
        uVar150 = uVar134 | 3;
        while ((int)uVar150 < (int)uVar157) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)*pauVar140;
          auVar163 = vcvtph2ps_f16c(auVar4);
          _local_328 = vfmadd231ps_fma(_local_328,auVar163,*(undefined1 (*) [16])*pauVar142);
          pauVar142 = (undefined1 (*) [32])(*pauVar142 + 0x10);
          pauVar140 = (undefined1 (*) [16])(*pauVar140 + 8);
          uVar150 = uVar134 + 7;
          uVar134 = uVar134 + 4;
        }
        if ((int)uVar134 < (int)uVar157) {
          lVar146 = 0;
          do {
            local_2b8._0_4_ = auVar215._0_4_;
            local_318._0_4_ = *(undefined4 *)(*pauVar142 + lVar146 * 4);
            auVar217._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar140 + lVar146 * 2));
            auVar217._4_60_ = extraout_var_01;
            auVar163 = vfmadd231ss_fma(ZEXT416((uint)local_2b8._0_4_),auVar217._0_16_,
                                       ZEXT416((uint)local_318._0_4_));
            fVar263 = auVar163._0_4_;
            auVar215 = ZEXT1664(auVar163);
            lVar146 = lVar146 + 1;
          } while (uVar157 - uVar134 != (int)lVar146);
        }
        auVar233._0_4_ = (float)local_218._0_4_ + (float)local_328._0_4_ + fStack_208;
        auVar233._4_4_ = (float)local_218._4_4_ + (float)local_328._4_4_ + fStack_204;
        auVar233._8_4_ = fStack_210 + fStack_320 + fStack_200;
        auVar233._12_4_ = fStack_20c + fStack_31c + fStack_1fc;
        auVar163 = vhaddps_avx(auVar233,auVar233);
        auVar163 = vhaddps_avx(auVar163,auVar163);
        fVar263 = auVar163._0_4_ + fVar263;
        auVar163 = ZEXT416((uint)fVar263);
        fVar230 = fVar263;
        switch(iVar5) {
        case 1:
          auVar163 = vmaxss_avx(auVar163,ZEXT416(0));
          fVar230 = auVar163._0_4_;
          break;
        case 2:
          uVar15 = vcmpss_avx512f(auVar163,ZEXT416(0),0xe);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar230 = (float)((uint)bVar11 * 0x3f800000 +
                           (uint)!bVar11 * **(int **)(&this->field_0xe8 + (long)p_Var6)) * fVar263;
          break;
        case 3:
          fVar263 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar163 = vmaxss_avx(auVar163,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
          fVar230 = auVar163._0_4_;
          if (fVar263 < auVar163._0_4_) {
            fVar230 = fVar263;
          }
          break;
        case 4:
          auVar163 = vminss_avx(auVar163,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar56._8_4_ = 0x80000000;
          auVar56._0_8_ = 0x8000000080000000;
          auVar56._12_4_ = 0x80000000;
          auVar164 = vxorps_avx512vl(auVar163,auVar56);
          uVar15 = vcmpss_avx512f(auVar163,ZEXT416(0xc2b0c0a5),1);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar263 = expf((float)((uint)bVar11 * 0x42b0c0a5 + (uint)!bVar11 * auVar164._0_4_));
          fVar230 = 1.0 / (fVar263 + 1.0);
          break;
        case 5:
          local_2b8._0_4_ = fVar263;
          fVar263 = expf(fVar263);
          fVar263 = logf(fVar263 + 1.0);
          fVar230 = tanhf(fVar263);
          fVar230 = fVar230 * (float)local_2b8._0_4_;
          break;
        case 6:
          fVar2 = **(float **)(&this->field_0xe8 + (long)p_Var6);
          auVar55._8_4_ = 0x80000000;
          auVar55._0_8_ = 0x8000000080000000;
          auVar55._12_4_ = 0x80000000;
          auVar165 = ZEXT416((uint)(*(float **)(&this->field_0xe8 + (long)p_Var6))[1]);
          auVar164 = vxorps_avx512vl(auVar165,auVar55);
          fVar264 = auVar164._0_4_ / fVar2;
          fVar230 = 0.0;
          if ((fVar264 <= fVar263) && (fVar230 = fVar263, fVar263 <= fVar264 + 1.0 / fVar2)) {
            auVar163 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar163,auVar165);
            fVar230 = auVar163._0_4_ * fVar263;
          }
        }
        *(float *)((long)top_blob->data + uVar156 * 4) = fVar230;
        uVar156 = uVar156 + 1;
      } while (uVar156 != local_238);
    }
    else if ((iVar133 == 4) && (0 < (int)uVar134)) {
      uVar136 = 0;
      auVar231 = ZEXT816(0) << 0x40;
      auVar163 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar164 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar279._8_4_ = 0x3f000000;
      auVar279._0_8_ = 0x3f0000003f000000;
      auVar279._12_4_ = 0x3f000000;
      auVar165 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar294._8_4_ = 0x3f800000;
      auVar294._0_8_ = 0x3f8000003f800000;
      auVar294._12_4_ = 0x3f800000;
      auVar298._8_4_ = 0x3f318000;
      auVar298._0_8_ = 0x3f3180003f318000;
      auVar298._12_4_ = 0x3f318000;
      auVar307._8_4_ = 0x39506967;
      auVar307._0_8_ = 0x3950696739506967;
      auVar307._12_4_ = 0x39506967;
      auVar311._8_4_ = 0x3ab743ce;
      auVar311._0_8_ = 0x3ab743ce3ab743ce;
      auVar311._12_4_ = 0x3ab743ce;
      auVar315._8_4_ = 0x3c088908;
      auVar315._0_8_ = 0x3c0889083c088908;
      auVar315._12_4_ = 0x3c088908;
      auVar319._8_4_ = 0x3d2aa9c1;
      auVar319._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar319._12_4_ = 0x3d2aa9c1;
      auVar323._8_4_ = 0x3e2aaaaa;
      auVar323._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar323._12_4_ = 0x3e2aaaaa;
      auVar328._8_4_ = 0x3f800000;
      auVar328._0_8_ = 0x3f8000003f800000;
      auVar328._12_4_ = 0x3f800000;
      auVar331._8_4_ = 0xb95e8083;
      auVar331._0_8_ = 0xb95e8083b95e8083;
      auVar331._12_4_ = 0xb95e8083;
      auVar166 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar167 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar170 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        auVar175 = ZEXT816(0) << 0x40;
        if (lVar8 != 0) {
          auVar175 = *(undefined1 (*) [16])(lVar8 + uVar136 * 0x10);
        }
        pauVar142 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar136 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar171 = in_ZMM17._0_16_;
        auVar173 = in_ZMM18._0_16_;
        auVar172 = in_ZMM16._0_16_;
        pauVar138 = local_3b8;
        if ((int)uVar157 < 8) {
          auVar172 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM16 = ZEXT1664(auVar172);
          auVar172 = vxorps_avx512vl(auVar173,auVar173);
          in_ZMM18 = ZEXT1664(auVar172);
          auVar172 = vxorps_avx512vl(auVar171,auVar171);
          in_ZMM17 = ZEXT1664(auVar172);
          auVar215 = ZEXT864(0);
          uVar134 = 0;
        }
        else {
          auVar215 = ZEXT864(0);
          iVar145 = 7;
          auVar171 = vxorps_avx512vl(auVar171,auVar171);
          in_ZMM17 = ZEXT1664(auVar171);
          auVar171 = vxorps_avx512vl(auVar173,auVar173);
          in_ZMM18 = ZEXT1664(auVar171);
          auVar172 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM16 = ZEXT1664(auVar172);
          do {
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar138));
            auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 4)));
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 8)));
            auVar174 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0xc)));
            auVar191 = vinsertf32x4_avx512vl(ZEXT1632(auVar172),auVar171,1);
            auVar192 = vinsertf32x4_avx512vl(ZEXT1632(auVar173),auVar174,1);
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0x10)));
            auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0x14)));
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0x18)));
            auVar193 = vinsertf32x4_avx512vl(ZEXT1632(auVar172),auVar171,1);
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0x1c)));
            auVar194 = vinsertf32x4_avx512vl(ZEXT1632(auVar173),auVar172,1);
            auVar189 = vlddqu_avx(*pauVar142);
            auVar190 = vlddqu_avx(pauVar142[1]);
            auVar195 = vcvtph2ps_avx512vl(auVar189._0_16_);
            auVar191 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar191,auVar195);
            auVar215 = ZEXT3264(auVar191);
            auVar189 = vcvtph2ps_f16c(auVar189._16_16_);
            auVar189 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar192,auVar189);
            in_ZMM17 = ZEXT3264(auVar189);
            auVar189 = vcvtph2ps_f16c(auVar190._0_16_);
            auVar189 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar193,auVar189);
            in_ZMM18 = ZEXT3264(auVar189);
            auVar189 = vcvtph2ps_f16c(auVar190._16_16_);
            auVar189 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar194,auVar189);
            in_ZMM16 = ZEXT3264(auVar189);
            pauVar138 = pauVar138 + 1;
            pauVar142 = pauVar142 + 2;
            iVar145 = iVar145 + 8;
            uVar134 = uVar157 & 0xfffffff8;
          } while (iVar145 < (int)uVar157);
        }
        auVar189 = auVar215._0_32_;
        uVar150 = uVar134 | 3;
        while ((int)uVar150 < (int)uVar157) {
          uVar1 = *(undefined4 *)*pauVar138;
          auVar257._4_4_ = uVar1;
          auVar257._0_4_ = uVar1;
          auVar257._8_4_ = uVar1;
          auVar257._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar138 + 4);
          auVar257._20_4_ = uVar1;
          auVar257._16_4_ = uVar1;
          auVar257._24_4_ = uVar1;
          auVar257._28_4_ = uVar1;
          auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 8)));
          uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
          auVar265._4_4_ = uVar1;
          auVar265._0_4_ = uVar1;
          auVar265._8_4_ = uVar1;
          auVar265._12_4_ = uVar1;
          auVar191 = vinsertf32x4_avx512vl(ZEXT1632(auVar172),auVar265,1);
          auVar190 = vlddqu_avx(*pauVar142);
          auVar189 = vcvtph2ps_avx512vl(auVar190._0_16_);
          auVar189 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar257,auVar189);
          auVar215 = ZEXT3264(auVar189);
          auVar190 = vcvtph2ps_f16c(auVar190._16_16_);
          auVar190 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar191,auVar190);
          in_ZMM17 = ZEXT3264(auVar190);
          pauVar138 = (undefined1 (*) [32])(*pauVar138 + 0x10);
          pauVar142 = pauVar142 + 1;
          uVar150 = uVar134 + 7;
          uVar134 = uVar134 + 4;
        }
        if (uVar157 - uVar134 != 0 && (int)uVar134 <= (int)uVar157) {
          lVar146 = 0;
          do {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(*pauVar142 + lVar146 * 8);
            auVar172 = vcvtph2ps_f16c(auVar3);
            uVar1 = *(undefined4 *)(*pauVar138 + lVar146 * 4);
            auVar16._4_4_ = uVar1;
            auVar16._0_4_ = uVar1;
            auVar16._8_4_ = uVar1;
            auVar16._12_4_ = uVar1;
            auVar175 = vfmadd231ps_avx512vl(auVar175,auVar172,auVar16);
            lVar146 = lVar146 + 1;
          } while (uVar157 - uVar134 != (int)lVar146);
        }
        auVar190 = vaddps_avx512vl(in_ZMM18._0_32_,in_ZMM16._0_32_);
        auVar189 = vaddps_avx512vl(in_ZMM17._0_32_,auVar189);
        fVar263 = auVar190._4_4_ + auVar189._4_4_;
        auVar181._0_4_ =
             auVar190._16_4_ + auVar189._16_4_ + auVar190._0_4_ + auVar189._0_4_ + auVar175._0_4_;
        auVar181._4_4_ = fVar263 + fVar263 + auVar175._4_4_;
        auVar181._8_4_ =
             auVar190._24_4_ + auVar189._24_4_ + auVar190._8_4_ + auVar189._8_4_ + auVar175._8_4_;
        auVar181._12_4_ =
             auVar190._28_4_ + auVar189._28_4_ + auVar190._12_4_ + auVar189._12_4_ + auVar175._12_4_
        ;
        switch(iVar5) {
        case 1:
          auVar181 = vmaxps_avx(auVar181,auVar231);
          break;
        case 2:
          auVar175 = vmaxps_avx(auVar181,auVar231);
          auVar172 = vminps_avx(auVar181,auVar231);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar31._4_4_ = uVar1;
          auVar31._0_4_ = uVar1;
          auVar31._8_4_ = uVar1;
          auVar31._12_4_ = uVar1;
          auVar181 = vfmadd132ps_avx512vl(auVar172,auVar175,auVar31);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar29._4_4_ = uVar1;
          auVar29._0_4_ = uVar1;
          auVar29._8_4_ = uVar1;
          auVar29._12_4_ = uVar1;
          auVar175 = vmaxps_avx512vl(auVar181,auVar29);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar30._4_4_ = uVar1;
          auVar30._0_4_ = uVar1;
          auVar30._8_4_ = uVar1;
          auVar30._12_4_ = uVar1;
          auVar181 = vminps_avx512vl(auVar175,auVar30);
          break;
        case 4:
          auVar27._8_4_ = 0x80000000;
          auVar27._0_8_ = 0x8000000080000000;
          auVar27._12_4_ = 0x80000000;
          auVar175 = vxorps_avx512vl(auVar181,auVar27);
          auVar175 = vminps_avx512vl(auVar175,auVar163);
          auVar172 = vmaxps_avx512vl(auVar175,auVar164);
          auVar171 = vfmadd231ps_avx512vl(auVar279,auVar172,auVar165);
          auVar270._0_4_ = (int)auVar171._0_4_;
          auVar270._4_4_ = (int)auVar171._4_4_;
          auVar270._8_4_ = (int)auVar171._8_4_;
          auVar270._12_4_ = (int)auVar171._12_4_;
          auVar175 = vcvtdq2ps_avx(auVar270);
          uVar13 = vcmpps_avx512vl(auVar171,auVar175,1);
          auVar171 = vsubps_avx512vl(auVar175,auVar294);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar182._0_4_ = (float)((uint)bVar11 * auVar171._0_4_ | (uint)!bVar11 * auVar175._0_4_);
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar182._4_4_ = (float)((uint)bVar11 * auVar171._4_4_ | (uint)!bVar11 * auVar175._4_4_);
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar182._8_4_ = (float)((uint)bVar11 * auVar171._8_4_ | (uint)!bVar11 * auVar175._8_4_);
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar182._12_4_ =
               (float)((uint)bVar11 * auVar171._12_4_ | (uint)!bVar11 * auVar175._12_4_);
          auVar175 = vfmsub231ps_fma(auVar172,auVar182,auVar298);
          auVar28._8_4_ = 0x395e8083;
          auVar28._0_8_ = 0x395e8083395e8083;
          auVar28._12_4_ = 0x395e8083;
          auVar172 = vfmsub231ps_avx512vl(auVar175,auVar182,auVar28);
          auVar246._0_4_ = auVar172._0_4_ * auVar172._0_4_;
          auVar246._4_4_ = auVar172._4_4_ * auVar172._4_4_;
          auVar246._8_4_ = auVar172._8_4_ * auVar172._8_4_;
          auVar246._12_4_ = auVar172._12_4_ * auVar172._12_4_;
          auVar175 = vfmadd213ps_fma(auVar307,auVar172,auVar311);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar315);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar319);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar323);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar279);
          auVar175 = vfmadd213ps_fma(auVar175,auVar246,auVar172);
          auVar247._0_4_ = auVar175._0_4_ + 1.0;
          auVar247._4_4_ = auVar175._4_4_ + 1.0;
          auVar247._8_4_ = auVar175._8_4_ + 1.0;
          auVar247._12_4_ = auVar175._12_4_ + 1.0;
          auVar235._0_4_ = (int)auVar182._0_4_;
          auVar235._4_4_ = (int)auVar182._4_4_;
          auVar235._8_4_ = (int)auVar182._8_4_;
          auVar235._12_4_ = (int)auVar182._12_4_;
          auVar175 = vpslld_avx(auVar235,0x17);
          auVar175 = vpaddd_avx(auVar328,auVar175);
          auVar172 = vfmadd213ps_fma(auVar175,auVar247,auVar294);
          auVar175 = vrcpps_avx(auVar172);
          auVar172 = vfmsub213ps_fma(auVar172,auVar175,auVar294);
          auVar181 = vfnmadd132ps_fma(auVar172,auVar175,auVar175);
          break;
        case 5:
          auVar175 = vminps_avx512vl(auVar181,auVar163);
          auVar171 = vmaxps_avx512vl(auVar175,auVar164);
          auVar172 = vfmadd213ps_fma(auVar165,auVar171,auVar279);
          auVar285._0_4_ = (int)auVar172._0_4_;
          auVar285._4_4_ = (int)auVar172._4_4_;
          auVar285._8_4_ = (int)auVar172._8_4_;
          auVar285._12_4_ = (int)auVar172._12_4_;
          auVar175 = vcvtdq2ps_avx(auVar285);
          uVar13 = vcmpps_avx512vl(auVar172,auVar175,1);
          auVar172 = vsubps_avx512vl(auVar175,auVar294);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar176._0_4_ = (float)((uint)bVar11 * auVar172._0_4_ | (uint)!bVar11 * auVar175._0_4_);
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar176._4_4_ = (float)((uint)bVar11 * auVar172._4_4_ | (uint)!bVar11 * auVar175._4_4_);
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar176._8_4_ = (float)((uint)bVar11 * auVar172._8_4_ | (uint)!bVar11 * auVar175._8_4_);
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar176._12_4_ =
               (float)((uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * auVar175._12_4_);
          auVar175 = vfmsub231ps_fma(auVar171,auVar176,auVar298);
          auVar172 = vfnmsub231ps_fma(auVar175,auVar176,auVar331);
          auVar266._0_4_ = auVar172._0_4_ * auVar172._0_4_;
          auVar266._4_4_ = auVar172._4_4_ * auVar172._4_4_;
          auVar266._8_4_ = auVar172._8_4_ * auVar172._8_4_;
          auVar266._12_4_ = auVar172._12_4_ * auVar172._12_4_;
          auVar175 = vfmadd213ps_fma(auVar307,auVar172,auVar311);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar315);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar319);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar323);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar279);
          auVar175 = vfmadd213ps_fma(auVar175,auVar266,auVar172);
          auVar243._0_4_ = auVar175._0_4_ + 1.0;
          auVar243._4_4_ = auVar175._4_4_ + 1.0;
          auVar243._8_4_ = auVar175._8_4_ + 1.0;
          auVar243._12_4_ = auVar175._12_4_ + 1.0;
          auVar267._0_4_ = (int)auVar176._0_4_;
          auVar267._4_4_ = (int)auVar176._4_4_;
          auVar267._8_4_ = (int)auVar176._8_4_;
          auVar267._12_4_ = (int)auVar176._12_4_;
          auVar175 = vpslld_avx(auVar267,0x17);
          auVar175 = vpaddd_avx(auVar328,auVar175);
          auVar175 = vfmadd213ps_fma(auVar175,auVar243,auVar294);
          uVar13 = vcmpps_avx512vl(auVar175,auVar231,2);
          auVar18._8_4_ = 0x800000;
          auVar18._0_8_ = 0x80000000800000;
          auVar18._12_4_ = 0x800000;
          auVar175 = vmaxps_avx512vl(auVar175,auVar18);
          auVar171 = vpsrld_avx(auVar175,0x17);
          auVar286._8_4_ = 0x807fffff;
          auVar286._0_8_ = 0x807fffff807fffff;
          auVar286._12_4_ = 0x807fffff;
          auVar19._8_4_ = 0x3f000000;
          auVar19._0_8_ = 0x3f0000003f000000;
          auVar19._12_4_ = 0x3f000000;
          auVar175 = vpternlogd_avx512vl(auVar175,auVar286,auVar19,0xea);
          auVar20._8_4_ = 0x3f3504f3;
          auVar20._0_8_ = 0x3f3504f33f3504f3;
          auVar20._12_4_ = 0x3f3504f3;
          uVar14 = vcmpps_avx512vl(auVar175,auVar20,1);
          auVar21._8_4_ = 0xbf800000;
          auVar21._0_8_ = 0xbf800000bf800000;
          auVar21._12_4_ = 0xbf800000;
          auVar172 = vaddps_avx512vl(auVar175,auVar21);
          auVar175 = vaddps_avx512vl(auVar172,auVar175);
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar177._0_4_ = (float)((uint)bVar11 * auVar175._0_4_ | (uint)!bVar11 * auVar172._0_4_);
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar177._4_4_ = (float)((uint)bVar11 * auVar175._4_4_ | (uint)!bVar11 * auVar172._4_4_);
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar177._8_4_ = (float)((uint)bVar11 * auVar175._8_4_ | (uint)!bVar11 * auVar172._8_4_);
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar177._12_4_ =
               (float)((uint)bVar11 * auVar175._12_4_ | (uint)!bVar11 * auVar172._12_4_);
          auVar244._0_4_ = auVar177._0_4_ * auVar177._0_4_;
          auVar244._4_4_ = auVar177._4_4_ * auVar177._4_4_;
          auVar244._8_4_ = auVar177._8_4_ * auVar177._8_4_;
          auVar244._12_4_ = auVar177._12_4_ * auVar177._12_4_;
          auVar303._8_4_ = 0x3d9021bb;
          auVar303._0_8_ = 0x3d9021bb3d9021bb;
          auVar303._12_4_ = 0x3d9021bb;
          auVar22._8_4_ = 0xbdebd1b8;
          auVar22._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar22._12_4_ = 0xbdebd1b8;
          auVar175 = vfmadd213ps_avx512vl(auVar303,auVar177,auVar22);
          auVar23._8_4_ = 0x3def251a;
          auVar23._0_8_ = 0x3def251a3def251a;
          auVar23._12_4_ = 0x3def251a;
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar23);
          auVar24._8_4_ = 0xbdfe5d4f;
          auVar24._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar24._12_4_ = 0xbdfe5d4f;
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar24);
          auVar25._8_4_ = 0x3e11e9bf;
          auVar25._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar25._12_4_ = 0x3e11e9bf;
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar25);
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar166);
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar167);
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar168);
          auVar175 = vfmadd213ps_avx512vl(auVar175,auVar177,auVar169);
          auVar172 = vmulps_avx512vl(auVar244,auVar177);
          in_ZMM16 = ZEXT1664(auVar172);
          auVar172 = vmulps_avx512vl(auVar172,auVar175);
          auVar26._8_4_ = 0xffffff82;
          auVar26._0_8_ = 0xffffff82ffffff82;
          auVar26._12_4_ = 0xffffff82;
          auVar175 = vpaddd_avx512vl(auVar171,auVar26);
          auVar175 = vcvtdq2ps_avx(auVar175);
          auVar171 = vsubps_avx512vl(auVar175,auVar294);
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar178._0_4_ = (uint)bVar11 * auVar171._0_4_ | (uint)!bVar11 * auVar175._0_4_;
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar178._4_4_ = (uint)bVar11 * auVar171._4_4_ | (uint)!bVar11 * auVar175._4_4_;
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar178._8_4_ = (uint)bVar11 * auVar171._8_4_ | (uint)!bVar11 * auVar175._8_4_;
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar178._12_4_ = (uint)bVar11 * auVar171._12_4_ | (uint)!bVar11 * auVar175._12_4_;
          auVar175 = vfmadd231ps_fma(auVar172,auVar178,auVar331);
          auVar175 = vfmsub231ps_fma(auVar175,auVar279,auVar244);
          auVar175 = vsubps_avx(auVar175,auVar177);
          auVar175 = vfnmadd231ps_fma(auVar175,auVar298,auVar178);
          auVar172 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar179._0_4_ =
               (uint)bVar11 * auVar172._0_4_ |
               (uint)!bVar11 * (int)(auVar175._0_4_ + auVar175._0_4_);
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar179._4_4_ =
               (uint)bVar11 * auVar172._4_4_ |
               (uint)!bVar11 * (int)(auVar175._4_4_ + auVar175._4_4_);
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar179._8_4_ =
               (uint)bVar11 * auVar172._8_4_ |
               (uint)!bVar11 * (int)(auVar175._8_4_ + auVar175._8_4_);
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar179._12_4_ =
               (uint)bVar11 * auVar172._12_4_ |
               (uint)!bVar11 * (int)(auVar175._12_4_ + auVar175._12_4_);
          auVar175 = vminps_avx512vl(auVar179,auVar163);
          auVar171 = vmaxps_avx512vl(auVar175,auVar164);
          auVar172 = vfmadd213ps_fma(auVar165,auVar171,auVar279);
          auVar287._0_4_ = (int)auVar172._0_4_;
          auVar287._4_4_ = (int)auVar172._4_4_;
          auVar287._8_4_ = (int)auVar172._8_4_;
          auVar287._12_4_ = (int)auVar172._12_4_;
          auVar175 = vcvtdq2ps_avx(auVar287);
          uVar13 = vcmpps_avx512vl(auVar172,auVar175,1);
          auVar172 = vsubps_avx512vl(auVar175,auVar294);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar180._0_4_ = (float)((uint)bVar11 * auVar172._0_4_ | (uint)!bVar11 * auVar175._0_4_);
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar180._4_4_ = (float)((uint)bVar11 * auVar172._4_4_ | (uint)!bVar11 * auVar175._4_4_);
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar180._8_4_ = (float)((uint)bVar11 * auVar172._8_4_ | (uint)!bVar11 * auVar175._8_4_);
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar180._12_4_ =
               (float)((uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * auVar175._12_4_);
          auVar175 = vfmsub231ps_fma(auVar171,auVar180,auVar298);
          auVar172 = vfnmsub231ps_fma(auVar175,auVar180,auVar331);
          auVar268._0_4_ = auVar172._0_4_ * auVar172._0_4_;
          auVar268._4_4_ = auVar172._4_4_ * auVar172._4_4_;
          auVar268._8_4_ = auVar172._8_4_ * auVar172._8_4_;
          auVar268._12_4_ = auVar172._12_4_ * auVar172._12_4_;
          auVar175 = vfmadd213ps_fma(auVar307,auVar172,auVar311);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar315);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar319);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar323);
          auVar175 = vfmadd213ps_fma(auVar175,auVar172,auVar279);
          auVar175 = vfmadd213ps_fma(auVar175,auVar268,auVar172);
          auVar245._0_4_ = auVar175._0_4_ + 1.0;
          auVar245._4_4_ = auVar175._4_4_ + 1.0;
          auVar245._8_4_ = auVar175._8_4_ + 1.0;
          auVar245._12_4_ = auVar175._12_4_ + 1.0;
          auVar269._0_4_ = (int)auVar180._0_4_;
          auVar269._4_4_ = (int)auVar180._4_4_;
          auVar269._8_4_ = (int)auVar180._8_4_;
          auVar269._12_4_ = (int)auVar180._12_4_;
          auVar175 = vpslld_avx(auVar269,0x17);
          auVar175 = vpaddd_avx(auVar328,auVar175);
          auVar172 = vfmadd213ps_fma(auVar175,auVar245,auVar294);
          auVar175 = vrcpps_avx(auVar172);
          auVar288._0_4_ = auVar175._0_4_ + auVar175._0_4_;
          auVar288._4_4_ = auVar175._4_4_ + auVar175._4_4_;
          auVar288._8_4_ = auVar175._8_4_ + auVar175._8_4_;
          auVar288._12_4_ = auVar175._12_4_ + auVar175._12_4_;
          auVar172 = vfmsub213ps_avx512vl(auVar172,auVar288,auVar170);
          auVar175 = vfnmadd213ps_fma(auVar172,auVar175,auVar288);
          auVar181 = vfmsub231ps_fma(auVar181,auVar181,auVar175);
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar248._4_4_ = uVar1;
          auVar248._0_4_ = uVar1;
          auVar248._8_4_ = uVar1;
          auVar248._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar17._4_4_ = uVar1;
          auVar17._0_4_ = uVar1;
          auVar17._8_4_ = uVar1;
          auVar17._12_4_ = uVar1;
          auVar175 = vfmadd213ps_avx512vl(auVar248,auVar181,auVar17);
          auVar175 = vmaxps_avx(auVar175,auVar231);
          auVar175 = vminps_avx(auVar175,auVar294);
          auVar181._0_4_ = auVar175._0_4_ * auVar181._0_4_;
          auVar181._4_4_ = auVar175._4_4_ * auVar181._4_4_;
          auVar181._8_4_ = auVar175._8_4_ * auVar181._8_4_;
          auVar181._12_4_ = auVar175._12_4_ * auVar181._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar136 * 0x10) = auVar181;
        uVar136 = uVar136 + 1;
      } while (uVar136 != uVar156);
    }
    iVar145 = 0;
  }
LAB_002bb756:
  piVar7 = (int *)CONCAT44(uStack_3ac,uStack_3b0);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_398 == (Allocator *)0x0) {
        if (local_3b8 != (undefined1 (*) [32])0x0) {
          free(local_3b8);
        }
      }
      else {
        (*local_398->_vptr_Allocator[3])();
      }
    }
  }
  return iVar145;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}